

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Primitive PVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined3 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  RTCFilterFunctionN p_Var58;
  int iVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  bool bVar64;
  uint uVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  uint uVar69;
  short sVar70;
  float t1;
  undefined2 uVar99;
  float fVar71;
  float fVar100;
  float fVar101;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  float fVar121;
  float fVar122;
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar140;
  float fVar142;
  vfloat4 v;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar145;
  float fVar161;
  float fVar162;
  vfloat4 v_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  float fVar163;
  float fVar166;
  float fVar167;
  vfloat4 a;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar172;
  float fVar173;
  float fVar196;
  float fVar198;
  vfloat_impl<4> p00;
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  float fVar211;
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar214;
  float fVar223;
  float fVar225;
  vfloat4 a_2;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  float fVar224;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar228;
  float fVar238;
  float fVar239;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar241;
  float fVar252;
  float fVar254;
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  float fVar253;
  float fVar255;
  float fVar256;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar268;
  float fVar271;
  vfloat4 a_1;
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar276;
  float fVar277;
  float fVar286;
  float fVar288;
  vfloat4 a_3;
  float fVar290;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar282 [16];
  float fVar287;
  float fVar289;
  float fVar291;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar292;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_43d;
  uint local_43c;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  undefined8 local_418;
  undefined4 local_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  ulong local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong local_300;
  Primitive *local_2f8;
  long local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 uVar98;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar159 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  
  PVar10 = prim[1];
  uVar54 = (ulong)(byte)PVar10;
  lVar17 = uVar54 * 0x25;
  pPVar4 = prim + lVar17 + 6;
  fVar142 = *(float *)(pPVar4 + 0xc);
  fVar145 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar142;
  fVar161 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar142;
  fVar162 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar142;
  fVar123 = fVar142 * (ray->dir).field_0.m128[0];
  fVar140 = fVar142 * (ray->dir).field_0.m128[1];
  fVar142 = fVar142 * (ray->dir).field_0.m128[2];
  uVar11 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar60;
  auVar116._12_2_ = uVar99;
  auVar116._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar125._12_4_ = auVar116._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar60;
  auVar125._10_2_ = uVar99;
  auVar72._10_6_ = auVar125._10_6_;
  auVar72._8_2_ = uVar99;
  auVar72._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar31._4_8_ = auVar72._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar304 = (float)((int)sVar70 >> 8);
  fVar310 = (float)(auVar31._0_4_ >> 0x18);
  fVar312 = (float)(auVar72._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar105._8_4_ = 0;
  auVar105._0_8_ = uVar60;
  auVar105._12_2_ = uVar99;
  auVar105._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = uVar60;
  auVar104._10_2_ = uVar99;
  auVar103._10_6_ = auVar104._10_6_;
  auVar103._8_2_ = uVar99;
  auVar103._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar32._4_8_ = auVar103._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar163 = (float)((int)sVar70 >> 8);
  fVar166 = (float)(auVar32._0_4_ >> 0x18);
  fVar167 = (float)(auVar103._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar60;
  auVar108._12_2_ = uVar99;
  auVar108._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_2_ = 0;
  auVar107._0_8_ = uVar60;
  auVar107._10_2_ = uVar99;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._8_2_ = uVar99;
  auVar106._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar33._4_8_ = auVar106._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar201 = (float)((int)sVar70 >> 8);
  fVar211 = (float)(auVar33._0_4_ >> 0x18);
  fVar212 = (float)(auVar106._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar60;
  auVar111._12_2_ = uVar99;
  auVar111._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar60;
  auVar110._10_2_ = uVar99;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar99;
  auVar109._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar34._4_8_ = auVar109._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar71 = (float)((int)sVar70 >> 8);
  fVar100 = (float)(auVar34._0_4_ >> 0x18);
  fVar101 = (float)(auVar109._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar60;
  auVar176._12_2_ = uVar99;
  auVar176._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar60;
  auVar175._10_2_ = uVar99;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar99;
  auVar174._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar35._4_8_ = auVar174._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  fVar213 = (float)((int)sVar70 >> 8);
  fVar223 = (float)(auVar35._0_4_ >> 0x18);
  fVar225 = (float)(auVar174._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar54 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar60;
  auVar179._12_2_ = uVar99;
  auVar179._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar60;
  auVar178._10_2_ = uVar99;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar99;
  auVar177._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar36._4_8_ = auVar177._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar240 = (float)((int)sVar70 >> 8);
  fVar252 = (float)(auVar36._0_4_ >> 0x18);
  fVar254 = (float)(auVar177._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar60;
  auVar182._12_2_ = uVar99;
  auVar182._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar60;
  auVar181._10_2_ = uVar99;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar99;
  auVar180._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar37._4_8_ = auVar180._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  fVar228 = (float)((int)sVar70 >> 8);
  fVar238 = (float)(auVar37._0_4_ >> 0x18);
  fVar239 = (float)(auVar180._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar60;
  auVar185._12_2_ = uVar99;
  auVar185._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar60;
  auVar184._10_2_ = uVar99;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar99;
  auVar183._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar38._4_8_ = auVar183._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar257 = (float)((int)sVar70 >> 8);
  fVar268 = (float)(auVar38._0_4_ >> 0x18);
  fVar271 = (float)(auVar183._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar30,sVar70);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar60;
  auVar188._12_2_ = uVar99;
  auVar188._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar60;
  auVar187._10_2_ = uVar99;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar99;
  auVar186._0_8_ = uVar60;
  uVar99 = (undefined2)uVar30;
  auVar39._4_8_ = auVar186._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  fVar102 = (float)((int)sVar70 >> 8);
  fVar121 = (float)(auVar39._0_4_ >> 0x18);
  fVar122 = (float)(auVar186._8_4_ >> 0x18);
  fVar292 = fVar123 * fVar304 + fVar140 * fVar163 + fVar142 * fVar201;
  fVar301 = fVar123 * fVar310 + fVar140 * fVar166 + fVar142 * fVar211;
  fVar302 = fVar123 * fVar312 + fVar140 * fVar167 + fVar142 * fVar212;
  fVar303 = fVar123 * (float)(auVar125._12_4_ >> 0x18) +
            fVar140 * (float)(auVar104._12_4_ >> 0x18) + fVar142 * (float)(auVar107._12_4_ >> 0x18);
  fVar276 = fVar123 * fVar71 + fVar140 * fVar213 + fVar142 * fVar240;
  fVar286 = fVar123 * fVar100 + fVar140 * fVar223 + fVar142 * fVar252;
  fVar288 = fVar123 * fVar101 + fVar140 * fVar225 + fVar142 * fVar254;
  fVar290 = fVar123 * (float)(auVar110._12_4_ >> 0x18) +
            fVar140 * (float)(auVar175._12_4_ >> 0x18) + fVar142 * (float)(auVar178._12_4_ >> 0x18);
  fVar172 = fVar123 * fVar228 + fVar140 * fVar257 + fVar142 * fVar102;
  fVar196 = fVar123 * fVar238 + fVar140 * fVar268 + fVar142 * fVar121;
  fVar198 = fVar123 * fVar239 + fVar140 * fVar271 + fVar142 * fVar122;
  fVar123 = fVar123 * (float)(auVar181._12_4_ >> 0x18) +
            fVar140 * (float)(auVar184._12_4_ >> 0x18) + fVar142 * (float)(auVar187._12_4_ >> 0x18);
  fVar305 = fVar304 * fVar145 + fVar163 * fVar161 + fVar201 * fVar162;
  fVar310 = fVar310 * fVar145 + fVar166 * fVar161 + fVar211 * fVar162;
  fVar312 = fVar312 * fVar145 + fVar167 * fVar161 + fVar212 * fVar162;
  fVar314 = (float)(auVar125._12_4_ >> 0x18) * fVar145 +
            (float)(auVar104._12_4_ >> 0x18) * fVar161 + (float)(auVar107._12_4_ >> 0x18) * fVar162;
  fVar240 = fVar71 * fVar145 + fVar213 * fVar161 + fVar240 * fVar162;
  fVar252 = fVar100 * fVar145 + fVar223 * fVar161 + fVar252 * fVar162;
  fVar254 = fVar101 * fVar145 + fVar225 * fVar161 + fVar254 * fVar162;
  fVar304 = (float)(auVar110._12_4_ >> 0x18) * fVar145 +
            (float)(auVar175._12_4_ >> 0x18) * fVar161 + (float)(auVar178._12_4_ >> 0x18) * fVar162;
  fVar228 = fVar145 * fVar228 + fVar161 * fVar257 + fVar162 * fVar102;
  fVar238 = fVar145 * fVar238 + fVar161 * fVar268 + fVar162 * fVar121;
  fVar239 = fVar145 * fVar239 + fVar161 * fVar271 + fVar162 * fVar122;
  fVar257 = fVar145 * (float)(auVar181._12_4_ >> 0x18) +
            fVar161 * (float)(auVar184._12_4_ >> 0x18) + fVar162 * (float)(auVar187._12_4_ >> 0x18);
  fVar142 = (float)DAT_01ff1d40;
  fVar71 = DAT_01ff1d40._4_4_;
  fVar100 = DAT_01ff1d40._8_4_;
  fVar101 = DAT_01ff1d40._12_4_;
  uVar65 = -(uint)(fVar142 <= ABS(fVar292));
  uVar66 = -(uint)(fVar71 <= ABS(fVar301));
  uVar68 = -(uint)(fVar100 <= ABS(fVar302));
  uVar69 = -(uint)(fVar101 <= ABS(fVar303));
  auVar293._0_4_ = (uint)fVar292 & uVar65;
  auVar293._4_4_ = (uint)fVar301 & uVar66;
  auVar293._8_4_ = (uint)fVar302 & uVar68;
  auVar293._12_4_ = (uint)fVar303 & uVar69;
  auVar146._0_4_ = ~uVar65 & (uint)fVar142;
  auVar146._4_4_ = ~uVar66 & (uint)fVar71;
  auVar146._8_4_ = ~uVar68 & (uint)fVar100;
  auVar146._12_4_ = ~uVar69 & (uint)fVar101;
  auVar146 = auVar146 | auVar293;
  uVar65 = -(uint)(fVar142 <= ABS(fVar276));
  uVar66 = -(uint)(fVar71 <= ABS(fVar286));
  uVar68 = -(uint)(fVar100 <= ABS(fVar288));
  uVar69 = -(uint)(fVar101 <= ABS(fVar290));
  auVar278._0_4_ = (uint)fVar276 & uVar65;
  auVar278._4_4_ = (uint)fVar286 & uVar66;
  auVar278._8_4_ = (uint)fVar288 & uVar68;
  auVar278._12_4_ = (uint)fVar290 & uVar69;
  auVar202._0_4_ = ~uVar65 & (uint)fVar142;
  auVar202._4_4_ = ~uVar66 & (uint)fVar71;
  auVar202._8_4_ = ~uVar68 & (uint)fVar100;
  auVar202._12_4_ = ~uVar69 & (uint)fVar101;
  auVar202 = auVar202 | auVar278;
  uVar65 = -(uint)(fVar142 <= ABS(fVar172));
  uVar66 = -(uint)(fVar71 <= ABS(fVar196));
  uVar68 = -(uint)(fVar100 <= ABS(fVar198));
  uVar69 = -(uint)(fVar101 <= ABS(fVar123));
  auVar189._0_4_ = (uint)fVar172 & uVar65;
  auVar189._4_4_ = (uint)fVar196 & uVar66;
  auVar189._8_4_ = (uint)fVar198 & uVar68;
  auVar189._12_4_ = (uint)fVar123 & uVar69;
  auVar215._0_4_ = ~uVar65 & (uint)fVar142;
  auVar215._4_4_ = ~uVar66 & (uint)fVar71;
  auVar215._8_4_ = ~uVar68 & (uint)fVar100;
  auVar215._12_4_ = ~uVar69 & (uint)fVar101;
  auVar215 = auVar215 | auVar189;
  auVar72 = rcpps(_DAT_01ff1d40,auVar146);
  fVar142 = auVar72._0_4_;
  fVar101 = auVar72._4_4_;
  fVar163 = auVar72._8_4_;
  fVar213 = auVar72._12_4_;
  fVar142 = (1.0 - auVar146._0_4_ * fVar142) * fVar142 + fVar142;
  fVar101 = (1.0 - auVar146._4_4_ * fVar101) * fVar101 + fVar101;
  fVar163 = (1.0 - auVar146._8_4_ * fVar163) * fVar163 + fVar163;
  fVar213 = (1.0 - auVar146._12_4_ * fVar213) * fVar213 + fVar213;
  auVar72 = rcpps(auVar72,auVar202);
  fVar71 = auVar72._0_4_;
  fVar102 = auVar72._4_4_;
  fVar166 = auVar72._8_4_;
  fVar223 = auVar72._12_4_;
  fVar71 = (1.0 - auVar202._0_4_ * fVar71) * fVar71 + fVar71;
  fVar102 = (1.0 - auVar202._4_4_ * fVar102) * fVar102 + fVar102;
  fVar166 = (1.0 - auVar202._8_4_ * fVar166) * fVar166 + fVar166;
  fVar223 = (1.0 - auVar202._12_4_ * fVar223) * fVar223 + fVar223;
  auVar72 = rcpps(auVar72,auVar215);
  fVar100 = auVar72._0_4_;
  fVar121 = auVar72._4_4_;
  fVar167 = auVar72._8_4_;
  fVar225 = auVar72._12_4_;
  fVar100 = (1.0 - auVar215._0_4_ * fVar100) * fVar100 + fVar100;
  fVar121 = (1.0 - auVar215._4_4_ * fVar121) * fVar121 + fVar121;
  fVar167 = (1.0 - auVar215._8_4_ * fVar167) * fVar167 + fVar167;
  fVar225 = (1.0 - auVar215._12_4_ * fVar225) * fVar225 + fVar225;
  fVar268 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar17 + 0x16)) *
            *(float *)(prim + lVar17 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar99 = (undefined2)(uVar60 >> 0x30);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar60;
  auVar127._12_2_ = uVar99;
  auVar127._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar60 >> 0x20);
  auVar317._12_4_ = auVar127._12_4_;
  auVar317._8_2_ = 0;
  auVar317._0_8_ = uVar60;
  auVar317._10_2_ = uVar99;
  auVar73._10_6_ = auVar317._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar60;
  uVar99 = (undefined2)(uVar60 >> 0x10);
  auVar40._4_8_ = auVar73._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  fVar122 = (float)(auVar40._0_4_ >> 0x10);
  fVar172 = (float)(auVar73._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar99 = (undefined2)(uVar55 >> 0x30);
  auVar149._8_4_ = 0;
  auVar149._0_8_ = uVar55;
  auVar149._12_2_ = uVar99;
  auVar149._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar55 >> 0x20);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar55;
  auVar148._10_2_ = uVar99;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = uVar99;
  auVar147._0_8_ = uVar55;
  uVar99 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar147._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  uVar56 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar99 = (undefined2)(uVar56 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar56;
  auVar76._12_2_ = uVar99;
  auVar76._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar56 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar56;
  auVar75._10_2_ = uVar99;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar99;
  auVar74._0_8_ = uVar56;
  uVar99 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar74._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  fVar123 = (float)(auVar42._0_4_ >> 0x10);
  fVar196 = (float)(auVar74._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar99 = (undefined2)(uVar57 >> 0x30);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar57;
  auVar218._12_2_ = uVar99;
  auVar218._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar57 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar57;
  auVar217._10_2_ = uVar99;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar99;
  auVar216._0_8_ = uVar57;
  uVar99 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar216._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  uVar61 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar99 = (undefined2)(uVar61 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar61;
  auVar79._12_2_ = uVar99;
  auVar79._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar61 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar61;
  auVar78._10_2_ = uVar99;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar99;
  auVar77._0_8_ = uVar61;
  uVar99 = (undefined2)(uVar61 >> 0x10);
  auVar44._4_8_ = auVar77._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  fVar140 = (float)(auVar44._0_4_ >> 0x10);
  fVar198 = (float)(auVar77._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar5 = *(ulong *)(prim + uVar54 * 2 + uVar63 + 6);
  uVar99 = (undefined2)(uVar5 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar5;
  auVar244._12_2_ = uVar99;
  auVar244._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar5 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar5;
  auVar243._10_2_ = uVar99;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar99;
  auVar242._0_8_ = uVar5;
  uVar99 = (undefined2)(uVar5 >> 0x10);
  auVar45._4_8_ = auVar242._8_8_;
  auVar45._2_2_ = uVar99;
  auVar45._0_2_ = uVar99;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar99 = (undefined2)(uVar63 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar63;
  auVar82._12_2_ = uVar99;
  auVar82._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar63 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar63;
  auVar81._10_2_ = uVar99;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar99;
  auVar80._0_8_ = uVar63;
  uVar99 = (undefined2)(uVar63 >> 0x10);
  auVar46._4_8_ = auVar80._8_8_;
  auVar46._2_2_ = uVar99;
  auVar46._0_2_ = uVar99;
  fVar145 = (float)(auVar46._0_4_ >> 0x10);
  fVar201 = (float)(auVar80._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar99 = (undefined2)(uVar6 >> 0x30);
  auVar262._8_4_ = 0;
  auVar262._0_8_ = uVar6;
  auVar262._12_2_ = uVar99;
  auVar262._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar6 >> 0x20);
  auVar261._12_4_ = auVar262._12_4_;
  auVar261._8_2_ = 0;
  auVar261._0_8_ = uVar6;
  auVar261._10_2_ = uVar99;
  auVar260._10_6_ = auVar261._10_6_;
  auVar260._8_2_ = uVar99;
  auVar260._0_8_ = uVar6;
  uVar99 = (undefined2)(uVar6 >> 0x10);
  auVar47._4_8_ = auVar260._8_8_;
  auVar47._2_2_ = uVar99;
  auVar47._0_2_ = uVar99;
  uVar7 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar99 = (undefined2)(uVar7 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar7;
  auVar85._12_2_ = uVar99;
  auVar85._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar7 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar7;
  auVar84._10_2_ = uVar99;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar99;
  auVar83._0_8_ = uVar7;
  uVar99 = (undefined2)(uVar7 >> 0x10);
  auVar48._4_8_ = auVar83._8_8_;
  auVar48._2_2_ = uVar99;
  auVar48._0_2_ = uVar99;
  fVar161 = (float)(auVar48._0_4_ >> 0x10);
  fVar211 = (float)(auVar83._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar10 * 0x20 + 6);
  uVar99 = (undefined2)(uVar8 >> 0x30);
  auVar281._8_4_ = 0;
  auVar281._0_8_ = uVar8;
  auVar281._12_2_ = uVar99;
  auVar281._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar8 >> 0x20);
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._8_2_ = 0;
  auVar280._0_8_ = uVar8;
  auVar280._10_2_ = uVar99;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._8_2_ = uVar99;
  auVar279._0_8_ = uVar8;
  uVar99 = (undefined2)(uVar8 >> 0x10);
  auVar49._4_8_ = auVar279._8_8_;
  auVar49._2_2_ = uVar99;
  auVar49._0_2_ = uVar99;
  uVar9 = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar54) + 6);
  uVar99 = (undefined2)(uVar9 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar9;
  auVar88._12_2_ = uVar99;
  auVar88._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar9 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar9;
  auVar87._10_2_ = uVar99;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar99;
  auVar86._0_8_ = uVar9;
  uVar99 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar86._8_8_;
  auVar50._2_2_ = uVar99;
  auVar50._0_2_ = uVar99;
  fVar162 = (float)(auVar50._0_4_ >> 0x10);
  fVar212 = (float)(auVar86._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar296._8_4_ = 0;
  auVar296._0_8_ = uVar54;
  auVar296._12_2_ = uVar99;
  auVar296._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar295._12_4_ = auVar296._12_4_;
  auVar295._8_2_ = 0;
  auVar295._0_8_ = uVar54;
  auVar295._10_2_ = uVar99;
  auVar294._10_6_ = auVar295._10_6_;
  auVar294._8_2_ = uVar99;
  auVar294._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar51._4_8_ = auVar294._8_8_;
  auVar51._2_2_ = uVar99;
  auVar51._0_2_ = uVar99;
  auVar150._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar122) * fVar268 + fVar122) - fVar310) *
                fVar101,((((float)(int)(short)uVar55 - (float)(int)(short)uVar60) * fVar268 +
                         (float)(int)(short)uVar60) - fVar305) * fVar142);
  auVar150._8_4_ =
       ((((float)(auVar147._8_4_ >> 0x10) - fVar172) * fVar268 + fVar172) - fVar312) * fVar163;
  auVar150._12_4_ =
       ((((float)(auVar148._12_4_ >> 0x10) - (float)(auVar317._12_4_ >> 0x10)) * fVar268 +
        (float)(auVar317._12_4_ >> 0x10)) - fVar314) * fVar213;
  auVar219._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar56) * fVar268 +
        (float)(int)(short)uVar56) - fVar305) * fVar142;
  auVar219._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar123) * fVar268 + fVar123) - fVar310) * fVar101;
  auVar219._8_4_ =
       ((((float)(auVar216._8_4_ >> 0x10) - fVar196) * fVar268 + fVar196) - fVar312) * fVar163;
  auVar219._12_4_ =
       ((((float)(auVar217._12_4_ >> 0x10) - (float)(auVar75._12_4_ >> 0x10)) * fVar268 +
        (float)(auVar75._12_4_ >> 0x10)) - fVar314) * fVar213;
  auVar245._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar140) * fVar268 + fVar140) - fVar252) *
                fVar102,((((float)(int)(short)uVar5 - (float)(int)(short)uVar61) * fVar268 +
                         (float)(int)(short)uVar61) - fVar240) * fVar71);
  auVar245._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar198) * fVar268 + fVar198) - fVar254) * fVar166;
  auVar245._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar268 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar304) * fVar223;
  auVar263._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar63) * fVar268 +
        (float)(int)(short)uVar63) - fVar240) * fVar71;
  auVar263._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar145) * fVar268 + fVar145) - fVar252) * fVar102;
  auVar263._8_4_ =
       ((((float)(auVar260._8_4_ >> 0x10) - fVar201) * fVar268 + fVar201) - fVar254) * fVar166;
  auVar263._12_4_ =
       ((((float)(auVar261._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar268 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar304) * fVar223;
  auVar282._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar161) * fVar268 + fVar161) - fVar238) *
                fVar121,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar268 +
                         (float)(int)(short)uVar7) - fVar228) * fVar100);
  auVar282._8_4_ =
       ((((float)(auVar279._8_4_ >> 0x10) - fVar211) * fVar268 + fVar211) - fVar239) * fVar167;
  auVar282._12_4_ =
       ((((float)(auVar280._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar268 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar257) * fVar225;
  auVar297._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar9) * fVar268 + (float)(int)(short)uVar9
        ) - fVar228) * fVar100;
  auVar297._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar162) * fVar268 + fVar162) - fVar238) * fVar121;
  auVar297._8_4_ =
       ((((float)(auVar294._8_4_ >> 0x10) - fVar212) * fVar268 + fVar212) - fVar239) * fVar167;
  auVar297._12_4_ =
       ((((float)(auVar295._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar268 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar257) * fVar225;
  auVar124._8_4_ = auVar150._8_4_;
  auVar124._0_8_ = auVar150._0_8_;
  auVar124._12_4_ = auVar150._12_4_;
  auVar125 = minps(auVar124,auVar219);
  auVar89._8_4_ = auVar245._8_4_;
  auVar89._0_8_ = auVar245._0_8_;
  auVar89._12_4_ = auVar245._12_4_;
  auVar72 = minps(auVar89,auVar263);
  auVar125 = maxps(auVar125,auVar72);
  auVar90._8_4_ = auVar282._8_4_;
  auVar90._0_8_ = auVar282._0_8_;
  auVar90._12_4_ = auVar282._12_4_;
  auVar72 = minps(auVar90,auVar297);
  uVar11 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar112._4_4_ = uVar11;
  auVar112._0_4_ = uVar11;
  auVar112._8_4_ = uVar11;
  auVar112._12_4_ = uVar11;
  auVar72 = maxps(auVar72,auVar112);
  auVar72 = maxps(auVar125,auVar72);
  local_178 = auVar72._0_4_ * 0.99999964;
  fStack_174 = auVar72._4_4_ * 0.99999964;
  fStack_170 = auVar72._8_4_ * 0.99999964;
  fStack_16c = auVar72._12_4_ * 0.99999964;
  auVar72 = maxps(auVar150,auVar219);
  auVar125 = maxps(auVar245,auVar263);
  auVar72 = minps(auVar72,auVar125);
  auVar125 = maxps(auVar282,auVar297);
  fVar142 = ray->tfar;
  auVar91._4_4_ = fVar142;
  auVar91._0_4_ = fVar142;
  auVar91._8_4_ = fVar142;
  auVar91._12_4_ = fVar142;
  auVar125 = minps(auVar125,auVar91);
  auVar72 = minps(auVar72,auVar125);
  uVar65 = (uint)(byte)PVar10;
  auVar113._0_4_ = -(uint)(uVar65 != 0 && local_178 <= auVar72._0_4_ * 1.0000004);
  auVar113._4_4_ = -(uint)(1 < uVar65 && fStack_174 <= auVar72._4_4_ * 1.0000004);
  auVar113._8_4_ = -(uint)(2 < uVar65 && fStack_170 <= auVar72._8_4_ * 1.0000004);
  auVar113._12_4_ = -(uint)(3 < uVar65 && fStack_16c <= auVar72._12_4_ * 1.0000004);
  uVar65 = movmskps(uVar65,auVar113);
  local_43d = uVar65 != 0;
  if (uVar65 == 0) {
    return local_43d;
  }
  uVar65 = uVar65 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f8 = prim;
LAB_00c347b5:
  lVar17 = 0;
  if ((ulong)uVar65 != 0) {
    for (; (uVar65 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  local_360 = (ulong)*(uint *)(local_2f8 + 2);
  uVar66 = *(uint *)(local_2f8 + lVar17 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[local_360].ptr;
  fVar142 = pGVar12->fnumTimeSegments;
  fVar71 = (pGVar12->time_range).lower;
  fVar100 = (((ray->dir).field_0.m128[3] - fVar71) / ((pGVar12->time_range).upper - fVar71)) *
            fVar142;
  fVar71 = floorf(fVar100);
  fVar142 = fVar142 + -1.0;
  if (fVar142 <= fVar71) {
    fVar71 = fVar142;
  }
  fVar142 = 0.0;
  if (0.0 <= fVar71) {
    fVar142 = fVar71;
  }
  fVar100 = fVar100 - fVar142;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar66 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar62 = (long)(int)fVar142 * 0x38;
  lVar14 = *(long *)(_Var13 + lVar62);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar62);
  pfVar3 = (float *)(lVar14 + lVar15 * uVar55);
  fVar142 = *pfVar3;
  fVar71 = pfVar3[1];
  fVar101 = pfVar3[2];
  fVar102 = pfVar3[3];
  lVar17 = uVar55 + 1;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar17);
  fVar121 = *pfVar3;
  fVar122 = pfVar3[1];
  fVar123 = pfVar3[2];
  fVar140 = pfVar3[3];
  lVar1 = uVar55 + 2;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar1);
  fVar145 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar163 = pfVar3[3];
  lVar2 = uVar55 + 3;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar2);
  fVar166 = *pfVar3;
  fVar167 = pfVar3[1];
  fVar172 = pfVar3[2];
  fVar196 = pfVar3[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar62);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar62);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar55);
  fVar198 = *pfVar3;
  fVar201 = pfVar3[1];
  fVar211 = pfVar3[2];
  fVar212 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar17);
  fVar213 = *pfVar3;
  fVar223 = pfVar3[1];
  fVar225 = pfVar3[2];
  fVar240 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar252 = *pfVar3;
  fVar254 = pfVar3[1];
  fVar304 = pfVar3[2];
  fVar228 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar238 = *pfVar3;
  fVar239 = pfVar3[1];
  fVar257 = pfVar3[2];
  fVar268 = pfVar3[3];
  fVar314 = (fVar145 * 0.5 + fVar166 * 0.0 + fVar121 * 0.0) - fVar142 * 0.5;
  fVar141 = (fVar161 * 0.5 + fVar167 * 0.0 + fVar122 * 0.0) - fVar71 * 0.5;
  fVar143 = (fVar162 * 0.5 + fVar172 * 0.0 + fVar123 * 0.0) - fVar101 * 0.5;
  fVar144 = (fVar163 * 0.5 + fVar196 * 0.0 + fVar140 * 0.0) - fVar102 * 0.5;
  fVar277 = (fVar252 * 0.5 + fVar238 * 0.0 + fVar213 * 0.0) - fVar198 * 0.5;
  fVar287 = (fVar254 * 0.5 + fVar239 * 0.0 + fVar223 * 0.0) - fVar201 * 0.5;
  fVar289 = (fVar304 * 0.5 + fVar257 * 0.0 + fVar225 * 0.0) - fVar211 * 0.5;
  fVar291 = (fVar228 * 0.5 + fVar268 * 0.0 + fVar240 * 0.0) - fVar212 * 0.5;
  fVar276 = fVar145 * 0.0 + fVar166 * -0.0 + fVar121 + fVar142 * -0.0;
  fVar288 = fVar161 * 0.0 + fVar167 * -0.0 + fVar122 + fVar71 * -0.0;
  fVar292 = fVar162 * 0.0 + fVar172 * -0.0 + fVar123 + fVar101 * -0.0;
  fVar302 = fVar163 * 0.0 + fVar196 * -0.0 + fVar140 + fVar102 * -0.0;
  fVar306 = fVar252 * 0.0 + fVar238 * -0.0 + fVar213 + fVar198 * -0.0;
  fVar311 = fVar254 * 0.0 + fVar239 * -0.0 + fVar223 + fVar201 * -0.0;
  fVar313 = fVar304 * 0.0 + fVar257 * -0.0 + fVar225 + fVar211 * -0.0;
  fVar315 = fVar228 * 0.0 + fVar268 * -0.0 + fVar240 + fVar212 * -0.0;
  fVar271 = fVar166 * -0.0 + fVar145 + fVar121 * 0.0 + fVar142 * -0.0;
  fVar286 = fVar167 * -0.0 + fVar161 + fVar122 * 0.0 + fVar71 * -0.0;
  fVar290 = fVar172 * -0.0 + fVar162 + fVar123 * 0.0 + fVar101 * -0.0;
  fVar301 = fVar196 * -0.0 + fVar163 + fVar140 * 0.0 + fVar102 * -0.0;
  fVar303 = fVar142 * 0.0 + ((fVar166 * 0.5 + fVar145 * 0.0) - fVar121 * 0.5);
  fVar305 = fVar71 * 0.0 + ((fVar167 * 0.5 + fVar161 * 0.0) - fVar122 * 0.5);
  fVar310 = fVar101 * 0.0 + ((fVar172 * 0.5 + fVar162 * 0.0) - fVar123 * 0.5);
  fVar312 = fVar102 * 0.0 + ((fVar196 * 0.5 + fVar163 * 0.0) - fVar140 * 0.5);
  fVar121 = fVar238 * -0.0 + fVar252 + fVar213 * 0.0 + fVar198 * -0.0;
  fVar122 = fVar239 * -0.0 + fVar254 + fVar223 * 0.0 + fVar201 * -0.0;
  fVar123 = fVar257 * -0.0 + fVar304 + fVar225 * 0.0 + fVar211 * -0.0;
  fVar145 = fVar268 * -0.0 + fVar228 + fVar240 * 0.0 + fVar212 * -0.0;
  fVar142 = fVar198 * 0.0 + ((fVar238 * 0.5 + fVar252 * 0.0) - fVar213 * 0.5);
  fVar71 = fVar201 * 0.0 + ((fVar239 * 0.5 + fVar254 * 0.0) - fVar223 * 0.5);
  fVar101 = fVar211 * 0.0 + ((fVar257 * 0.5 + fVar304 * 0.0) - fVar225 * 0.5);
  fVar102 = fVar212 * 0.0 + ((fVar268 * 0.5 + fVar228 * 0.0) - fVar240 * 0.5);
  fVar213 = fVar141 * fVar306 - fVar311 * fVar314;
  fVar223 = fVar143 * fVar311 - fVar313 * fVar141;
  fVar225 = fVar314 * fVar313 - fVar306 * fVar143;
  fVar240 = fVar144 * fVar315 - fVar315 * fVar144;
  fVar166 = fVar141 * fVar277 - fVar287 * fVar314;
  fVar172 = fVar143 * fVar287 - fVar289 * fVar141;
  fVar196 = fVar314 * fVar289 - fVar277 * fVar143;
  fVar140 = fVar305 * fVar121 - fVar122 * fVar303;
  fVar161 = fVar310 * fVar122 - fVar123 * fVar305;
  fVar162 = fVar303 * fVar123 - fVar121 * fVar310;
  fVar163 = fVar312 * fVar145 - fVar145 * fVar312;
  fVar121 = fVar305 * fVar142 - fVar71 * fVar303;
  fVar122 = fVar310 * fVar71 - fVar101 * fVar305;
  fVar101 = fVar303 * fVar101 - fVar142 * fVar310;
  fVar201 = fVar225 * fVar225 + fVar223 * fVar223 + fVar213 * fVar213;
  auVar125 = ZEXT416((uint)fVar201);
  auVar72 = rsqrtss(ZEXT416((uint)fVar201),auVar125);
  fVar142 = auVar72._0_4_;
  fVar211 = fVar142 * 1.5 - fVar142 * fVar142 * fVar201 * 0.5 * fVar142;
  fVar252 = fVar213 * fVar166 + fVar225 * fVar196 + fVar223 * fVar172;
  fVar142 = fVar240 * fVar211;
  auVar72 = rcpss(auVar125,auVar125);
  fVar167 = (2.0 - fVar201 * auVar72._0_4_) * auVar72._0_4_;
  fVar198 = fVar162 * fVar162 + fVar161 * fVar161 + fVar140 * fVar140;
  auVar72 = ZEXT416((uint)fVar198);
  auVar125 = rsqrtss(ZEXT416((uint)fVar198),auVar72);
  fVar71 = auVar125._0_4_;
  fVar145 = fVar71 * 1.5 - fVar71 * fVar71 * fVar198 * 0.5 * fVar71;
  fVar212 = fVar140 * fVar121 + fVar162 * fVar101 + fVar161 * fVar122;
  fVar123 = fVar163 * fVar145;
  auVar72 = rcpss(auVar72,auVar72);
  fVar71 = (2.0 - fVar198 * auVar72._0_4_) * auVar72._0_4_;
  fVar214 = fVar302 * fVar223 * fVar211;
  fVar224 = fVar302 * fVar225 * fVar211;
  fVar226 = fVar302 * fVar213 * fVar211;
  fVar227 = fVar302 * fVar142;
  fVar258 = fVar276 - fVar214;
  fVar269 = fVar288 - fVar224;
  fVar272 = fVar292 - fVar226;
  fVar274 = fVar302 - fVar227;
  fVar241 = fVar302 * fVar167 * (fVar201 * fVar172 - fVar252 * fVar223) * fVar211 +
            fVar144 * fVar223 * fVar211;
  fVar253 = fVar302 * fVar167 * (fVar201 * fVar196 - fVar252 * fVar225) * fVar211 +
            fVar144 * fVar225 * fVar211;
  fVar255 = fVar302 * fVar167 * (fVar201 * fVar166 - fVar252 * fVar213) * fVar211 +
            fVar144 * fVar213 * fVar211;
  fVar256 = fVar302 * fVar167 * (fVar201 * (fVar144 * fVar291 - fVar291 * fVar144) -
                                fVar252 * fVar240) * fVar211 + fVar144 * fVar142;
  fVar214 = fVar214 + fVar276;
  fVar224 = fVar224 + fVar288;
  fVar226 = fVar226 + fVar292;
  fVar227 = fVar227 + fVar302;
  fVar276 = fVar301 * fVar161 * fVar145;
  fVar288 = fVar301 * fVar162 * fVar145;
  fVar292 = fVar301 * fVar140 * fVar145;
  fVar302 = fVar301 * fVar123;
  fVar306 = fVar271 - fVar276;
  fVar313 = fVar286 - fVar288;
  fVar168 = fVar290 - fVar292;
  fVar170 = fVar301 - fVar302;
  fVar277 = fVar301 * fVar71 * (fVar198 * fVar122 - fVar212 * fVar161) * fVar145 +
            fVar312 * fVar161 * fVar145;
  fVar287 = fVar301 * fVar71 * (fVar198 * fVar101 - fVar212 * fVar162) * fVar145 +
            fVar312 * fVar162 * fVar145;
  fVar289 = fVar301 * fVar71 * (fVar198 * fVar121 - fVar212 * fVar140) * fVar145 +
            fVar312 * fVar140 * fVar145;
  fVar291 = fVar301 * fVar71 * (fVar198 * (fVar312 * fVar102 - fVar102 * fVar312) -
                               fVar212 * fVar163) * fVar145 + fVar312 * fVar123;
  fVar276 = fVar276 + fVar271;
  fVar288 = fVar288 + fVar286;
  fVar292 = fVar292 + fVar290;
  fVar302 = fVar302 + fVar301;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar62);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar62);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar55);
  fVar142 = *pfVar3;
  fVar71 = pfVar3[1];
  fVar101 = pfVar3[2];
  fVar102 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar17);
  fVar121 = *pfVar3;
  fVar122 = pfVar3[1];
  fVar123 = pfVar3[2];
  fVar140 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar145 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar163 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar166 = *pfVar3;
  fVar167 = pfVar3[1];
  fVar172 = pfVar3[2];
  fVar196 = pfVar3[3];
  fVar311 = (fVar145 * 0.5 + fVar166 * 0.0 + fVar121 * 0.0) - fVar142 * 0.5;
  fVar315 = (fVar161 * 0.5 + fVar167 * 0.0 + fVar122 * 0.0) - fVar71 * 0.5;
  fVar169 = (fVar162 * 0.5 + fVar172 * 0.0 + fVar123 * 0.0) - fVar101 * 0.5;
  fVar171 = (fVar163 * 0.5 + fVar196 * 0.0 + fVar140 * 0.0) - fVar102 * 0.5;
  lVar15 = *(long *)(lVar14 + 0x38 + lVar62);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar62);
  uVar60 = lVar17 * lVar14;
  pfVar3 = (float *)(lVar15 + lVar14 * lVar2);
  fVar198 = *pfVar3;
  fVar201 = pfVar3[1];
  fVar211 = pfVar3[2];
  fVar212 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar1 * lVar14);
  fVar213 = *pfVar3;
  fVar223 = pfVar3[1];
  fVar225 = pfVar3[2];
  fVar240 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + uVar60);
  fVar252 = *pfVar3;
  fVar254 = pfVar3[1];
  fVar304 = pfVar3[2];
  fVar228 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + uVar55 * lVar14);
  fVar238 = *pfVar3;
  fVar239 = pfVar3[1];
  fVar257 = pfVar3[2];
  fVar268 = pfVar3[3];
  fVar259 = (fVar213 * 0.5 + fVar198 * 0.0 + fVar252 * 0.0) - fVar238 * 0.5;
  fVar270 = (fVar223 * 0.5 + fVar201 * 0.0 + fVar254 * 0.0) - fVar239 * 0.5;
  fVar273 = (fVar225 * 0.5 + fVar211 * 0.0 + fVar304 * 0.0) - fVar257 * 0.5;
  fVar275 = (fVar240 * 0.5 + fVar212 * 0.0 + fVar228 * 0.0) - fVar268 * 0.5;
  fVar271 = fVar145 * 0.0 + fVar166 * -0.0 + fVar121 + fVar142 * -0.0;
  fVar286 = fVar161 * 0.0 + fVar167 * -0.0 + fVar122 + fVar71 * -0.0;
  fVar290 = fVar162 * 0.0 + fVar172 * -0.0 + fVar123 + fVar101 * -0.0;
  fVar301 = fVar163 * 0.0 + fVar196 * -0.0 + fVar140 + fVar102 * -0.0;
  fVar173 = fVar166 * -0.0 + fVar145 + fVar121 * 0.0 + fVar142 * -0.0;
  fVar197 = fVar167 * -0.0 + fVar161 + fVar122 * 0.0 + fVar71 * -0.0;
  fVar199 = fVar172 * -0.0 + fVar162 + fVar123 * 0.0 + fVar101 * -0.0;
  fVar200 = fVar196 * -0.0 + fVar163 + fVar140 * 0.0 + fVar102 * -0.0;
  fVar145 = fVar142 * 0.0 + ((fVar166 * 0.5 + fVar145 * 0.0) - fVar121 * 0.5);
  fVar166 = fVar71 * 0.0 + ((fVar167 * 0.5 + fVar161 * 0.0) - fVar122 * 0.5);
  fVar167 = fVar101 * 0.0 + ((fVar172 * 0.5 + fVar162 * 0.0) - fVar123 * 0.5);
  fVar172 = fVar102 * 0.0 + ((fVar196 * 0.5 + fVar163 * 0.0) - fVar140 * 0.5);
  fVar121 = fVar213 * 0.0 + fVar198 * -0.0 + fVar252 + fVar238 * -0.0;
  fVar140 = fVar223 * 0.0 + fVar201 * -0.0 + fVar254 + fVar239 * -0.0;
  fVar161 = fVar225 * 0.0 + fVar211 * -0.0 + fVar304 + fVar257 * -0.0;
  fVar162 = fVar240 * 0.0 + fVar212 * -0.0 + fVar228 + fVar268 * -0.0;
  fVar142 = fVar198 * -0.0 + fVar213 + fVar252 * 0.0 + fVar238 * -0.0;
  fVar71 = fVar201 * -0.0 + fVar223 + fVar254 * 0.0 + fVar239 * -0.0;
  fVar101 = fVar211 * -0.0 + fVar225 + fVar304 * 0.0 + fVar257 * -0.0;
  fVar102 = fVar212 * -0.0 + fVar240 + fVar228 * 0.0 + fVar268 * -0.0;
  fVar123 = fVar238 * 0.0 + ((fVar198 * 0.5 + fVar213 * 0.0) - fVar252 * 0.5);
  fVar122 = fVar239 * 0.0 + ((fVar201 * 0.5 + fVar223 * 0.0) - fVar254 * 0.5);
  fVar196 = fVar257 * 0.0 + ((fVar211 * 0.5 + fVar225 * 0.0) - fVar304 * 0.5);
  fVar239 = fVar268 * 0.0 + ((fVar212 * 0.5 + fVar240 * 0.0) - fVar228 * 0.5);
  fVar240 = fVar315 * fVar121 - fVar140 * fVar311;
  fVar252 = fVar169 * fVar140 - fVar161 * fVar315;
  fVar254 = fVar311 * fVar161 - fVar121 * fVar169;
  fVar304 = fVar171 * fVar162 - fVar162 * fVar171;
  fVar163 = fVar315 * fVar259 - fVar270 * fVar311;
  fVar161 = fVar169 * fVar270 - fVar273 * fVar315;
  fVar162 = fVar311 * fVar273 - fVar259 * fVar169;
  fVar140 = fVar166 * fVar142 - fVar71 * fVar145;
  fVar201 = fVar167 * fVar71 - fVar101 * fVar166;
  fVar212 = fVar145 * fVar101 - fVar142 * fVar167;
  fVar223 = fVar172 * fVar102 - fVar102 * fVar172;
  fVar121 = fVar166 * fVar123 - fVar122 * fVar145;
  fVar122 = fVar167 * fVar122 - fVar196 * fVar166;
  fVar123 = fVar145 * fVar196 - fVar123 * fVar167;
  fVar102 = fVar254 * fVar254 + fVar252 * fVar252 + fVar240 * fVar240;
  auVar125 = ZEXT416((uint)fVar102);
  auVar72 = rsqrtss(ZEXT416((uint)fVar102),auVar125);
  fVar142 = auVar72._0_4_;
  fVar196 = fVar142 * 1.5 - fVar142 * fVar142 * fVar102 * 0.5 * fVar142;
  fVar142 = fVar240 * fVar163 + fVar254 * fVar162 + fVar252 * fVar161;
  auVar72 = rcpss(auVar125,auVar125);
  fVar71 = (2.0 - fVar102 * auVar72._0_4_) * auVar72._0_4_;
  fVar101 = fVar304 * fVar196;
  fVar257 = fVar212 * fVar212 + fVar201 * fVar201 + fVar140 * fVar140;
  auVar72 = ZEXT416((uint)fVar257);
  auVar125 = rsqrtss(ZEXT416((uint)fVar257),auVar72);
  fVar198 = auVar125._0_4_;
  fVar259 = fVar198 * 1.5 - fVar198 * fVar198 * fVar257 * 0.5 * fVar198;
  fVar270 = fVar140 * fVar121 + fVar212 * fVar123 + fVar201 * fVar122;
  auVar72 = rcpss(auVar72,auVar72);
  fVar273 = (2.0 - fVar257 * auVar72._0_4_) * auVar72._0_4_;
  fVar268 = fVar223 * fVar259;
  fVar198 = fVar301 * fVar252 * fVar196;
  fVar211 = fVar301 * fVar254 * fVar196;
  fVar213 = fVar301 * fVar240 * fVar196;
  fVar225 = fVar301 * fVar101;
  fVar161 = fVar301 * fVar71 * (fVar102 * fVar161 - fVar142 * fVar252) * fVar196 +
            fVar171 * fVar252 * fVar196;
  fVar162 = fVar301 * fVar71 * (fVar102 * fVar162 - fVar142 * fVar254) * fVar196 +
            fVar171 * fVar254 * fVar196;
  fVar163 = fVar301 * fVar71 * (fVar102 * fVar163 - fVar142 * fVar240) * fVar196 +
            fVar171 * fVar240 * fVar196;
  fVar196 = fVar301 * fVar71 * (fVar102 * (fVar171 * fVar275 - fVar275 * fVar171) -
                               fVar142 * fVar304) * fVar196 + fVar171 * fVar101;
  fVar240 = fVar271 - fVar198;
  fVar252 = fVar286 - fVar211;
  fVar254 = fVar290 - fVar213;
  fVar304 = fVar301 - fVar225;
  fVar198 = fVar198 + fVar271;
  fVar211 = fVar211 + fVar286;
  fVar213 = fVar213 + fVar290;
  fVar225 = fVar225 + fVar301;
  fVar142 = fVar200 * fVar201 * fVar259;
  fVar71 = fVar200 * fVar212 * fVar259;
  fVar101 = fVar200 * fVar140 * fVar259;
  fVar102 = fVar200 * fVar268;
  fVar201 = fVar200 * fVar273 * (fVar257 * fVar122 - fVar270 * fVar201) * fVar259 +
            fVar172 * fVar201 * fVar259;
  fVar228 = fVar200 * fVar273 * (fVar257 * fVar123 - fVar270 * fVar212) * fVar259 +
            fVar172 * fVar212 * fVar259;
  fVar238 = fVar200 * fVar273 * (fVar257 * fVar121 - fVar270 * fVar140) * fVar259 +
            fVar172 * fVar140 * fVar259;
  fVar223 = fVar200 * fVar273 * (fVar257 * (fVar172 * fVar239 - fVar239 * fVar172) -
                                fVar270 * fVar223) * fVar259 + fVar172 * fVar268;
  fVar121 = fVar173 - fVar142;
  fVar122 = fVar197 - fVar71;
  fVar123 = fVar199 - fVar101;
  fVar140 = fVar200 - fVar102;
  fVar142 = fVar142 + fVar173;
  fVar71 = fVar71 + fVar197;
  fVar101 = fVar101 + fVar199;
  fVar102 = fVar102 + fVar200;
  fVar212 = 1.0 - fVar100;
  local_398 = fVar258 * fVar212 + fVar240 * fVar100;
  fStack_394 = fVar269 * fVar212 + fVar252 * fVar100;
  fStack_390 = fVar272 * fVar212 + fVar254 * fVar100;
  fStack_38c = fVar274 * fVar212 + fVar304 * fVar100;
  local_3a8 = ((fVar314 - fVar241) * 0.33333334 + fVar258) * fVar212 +
              ((fVar311 - fVar161) * 0.33333334 + fVar240) * fVar100;
  fStack_3a4 = ((fVar141 - fVar253) * 0.33333334 + fVar269) * fVar212 +
               ((fVar315 - fVar162) * 0.33333334 + fVar252) * fVar100;
  fStack_3a0 = ((fVar143 - fVar255) * 0.33333334 + fVar272) * fVar212 +
               ((fVar169 - fVar163) * 0.33333334 + fVar254) * fVar100;
  fStack_39c = ((fVar144 - fVar256) * 0.33333334 + fVar274) * fVar212 +
               ((fVar171 - fVar196) * 0.33333334 + fVar304) * fVar100;
  local_3b8 = (fVar306 - (fVar303 - fVar277) * 0.33333334) * fVar212 +
              (fVar121 - (fVar145 - fVar201) * 0.33333334) * fVar100;
  fStack_3b4 = (fVar313 - (fVar305 - fVar287) * 0.33333334) * fVar212 +
               (fVar122 - (fVar166 - fVar228) * 0.33333334) * fVar100;
  fStack_3b0 = (fVar168 - (fVar310 - fVar289) * 0.33333334) * fVar212 +
               (fVar123 - (fVar167 - fVar238) * 0.33333334) * fVar100;
  fStack_3ac = (fVar170 - (fVar312 - fVar291) * 0.33333334) * fVar212 +
               (fVar140 - (fVar172 - fVar223) * 0.33333334) * fVar100;
  local_3c8 = fVar306 * fVar212 + fVar121 * fVar100;
  fStack_3c4 = fVar313 * fVar212 + fVar122 * fVar100;
  fStack_3c0 = fVar168 * fVar212 + fVar123 * fVar100;
  fStack_3bc = fVar170 * fVar212 + fVar140 * fVar100;
  local_388 = fVar214 * fVar212 + fVar198 * fVar100;
  fStack_384 = fVar224 * fVar212 + fVar211 * fVar100;
  fStack_380 = fVar226 * fVar212 + fVar213 * fVar100;
  fStack_37c = fVar227 * fVar212 + fVar225 * fVar100;
  local_378 = ((fVar241 + fVar314) * 0.33333334 + fVar214) * fVar212 +
              ((fVar161 + fVar311) * 0.33333334 + fVar198) * fVar100;
  fStack_374 = ((fVar253 + fVar141) * 0.33333334 + fVar224) * fVar212 +
               ((fVar162 + fVar315) * 0.33333334 + fVar211) * fVar100;
  fStack_370 = ((fVar255 + fVar143) * 0.33333334 + fVar226) * fVar212 +
               ((fVar163 + fVar169) * 0.33333334 + fVar213) * fVar100;
  fStack_36c = ((fVar256 + fVar144) * 0.33333334 + fVar227) * fVar212 +
               ((fVar196 + fVar171) * 0.33333334 + fVar225) * fVar100;
  local_3d8 = (fVar276 - (fVar277 + fVar303) * 0.33333334) * fVar212 +
              (fVar142 - (fVar201 + fVar145) * 0.33333334) * fVar100;
  fStack_3d4 = (fVar288 - (fVar287 + fVar305) * 0.33333334) * fVar212 +
               (fVar71 - (fVar228 + fVar166) * 0.33333334) * fVar100;
  fStack_3d0 = (fVar292 - (fVar289 + fVar310) * 0.33333334) * fVar212 +
               (fVar101 - (fVar238 + fVar167) * 0.33333334) * fVar100;
  fStack_3cc = (fVar302 - (fVar291 + fVar312) * 0.33333334) * fVar212 +
               (fVar102 - (fVar223 + fVar172) * 0.33333334) * fVar100;
  local_2b8 = fVar212 * fVar276 + fVar100 * fVar142;
  fStack_2b4 = fVar212 * fVar288 + fVar100 * fVar71;
  fStack_2b0 = fVar212 * fVar292 + fVar100 * fVar101;
  fStack_2ac = fVar212 * fVar302 + fVar100 * fVar102;
  fVar142 = (ray->org).field_0.m128[0];
  fVar71 = (ray->org).field_0.m128[1];
  fVar100 = (ray->org).field_0.m128[2];
  fVar101 = (pre->ray_space).vx.field_0.m128[0];
  fVar102 = (pre->ray_space).vx.field_0.m128[1];
  fVar121 = (pre->ray_space).vy.field_0.m128[0];
  fVar122 = (pre->ray_space).vy.field_0.m128[1];
  fVar123 = (pre->ray_space).vz.field_0.m128[0];
  fVar140 = (pre->ray_space).vz.field_0.m128[1];
  local_318 = (local_398 - fVar142) * fVar101 +
              (fStack_394 - fVar71) * fVar121 + (fStack_390 - fVar100) * fVar123;
  fStack_314 = (local_398 - fVar142) * fVar102 +
               (fStack_394 - fVar71) * fVar122 + (fStack_390 - fVar100) * fVar140;
  local_208 = CONCAT44(fStack_314,local_318);
  fVar145 = (local_3a8 - fVar142) * fVar101 +
            (fStack_3a4 - fVar71) * fVar121 + (fStack_3a0 - fVar100) * fVar123;
  fVar161 = (local_3a8 - fVar142) * fVar102 +
            (fStack_3a4 - fVar71) * fVar122 + (fStack_3a0 - fVar100) * fVar140;
  local_218 = CONCAT44(fVar161,fVar145);
  fVar162 = (local_3b8 - fVar142) * fVar101 +
            (fStack_3b4 - fVar71) * fVar121 + (fStack_3b0 - fVar100) * fVar123;
  fVar163 = (local_3b8 - fVar142) * fVar102 +
            (fStack_3b4 - fVar71) * fVar122 + (fStack_3b0 - fVar100) * fVar140;
  local_338 = CONCAT44(fVar163,fVar162);
  fVar166 = (local_3c8 - fVar142) * fVar101 +
            (fStack_3c4 - fVar71) * fVar121 + (fStack_3c0 - fVar100) * fVar123;
  fVar167 = (local_3c8 - fVar142) * fVar102 +
            (fStack_3c4 - fVar71) * fVar122 + (fStack_3c0 - fVar100) * fVar140;
  local_238 = CONCAT44(fVar167,fVar166);
  fStack_310 = (local_388 - fVar142) * fVar101 +
               (fStack_384 - fVar71) * fVar121 + (fStack_380 - fVar100) * fVar123;
  fStack_30c = (local_388 - fVar142) * fVar102 +
               (fStack_384 - fVar71) * fVar122 + (fStack_380 - fVar100) * fVar140;
  local_248 = CONCAT44(fStack_30c,fStack_310);
  fVar172 = (local_378 - fVar142) * fVar101 +
            (fStack_374 - fVar71) * fVar121 + (fStack_370 - fVar100) * fVar123;
  fVar196 = (local_378 - fVar142) * fVar102 +
            (fStack_374 - fVar71) * fVar122 + (fStack_370 - fVar100) * fVar140;
  local_258 = CONCAT44(fVar196,fVar172);
  fVar198 = (local_3d8 - fVar142) * fVar101 +
            (fStack_3d4 - fVar71) * fVar121 + (fStack_3d0 - fVar100) * fVar123;
  fVar201 = (local_3d8 - fVar142) * fVar102 +
            (fStack_3d4 - fVar71) * fVar122 + (fStack_3d0 - fVar100) * fVar140;
  uStack_330 = CONCAT44(fVar201,fVar198);
  fVar101 = (local_2b8 - fVar142) * fVar101 +
            (fStack_2b4 - fVar71) * fVar121 + (fStack_2b0 - fVar100) * fVar123;
  fVar71 = (local_2b8 - fVar142) * fVar102 +
           (fStack_2b4 - fVar71) * fVar122 + (fStack_2b0 - fVar100) * fVar140;
  local_278 = CONCAT44(fVar71,fVar101);
  register0x000012c8 = local_258;
  local_328 = local_218;
  register0x00001388 = local_278;
  local_b8 = local_238;
  auVar92._8_4_ = fStack_310;
  auVar92._0_8_ = local_208;
  auVar92._12_4_ = fStack_30c;
  auVar72 = minps(auVar92,_local_328);
  auVar114._8_4_ = fVar198;
  auVar114._0_8_ = local_338;
  auVar114._12_4_ = fVar201;
  auVar125 = minps(auVar114,_local_b8);
  auVar72 = minps(auVar72,auVar125);
  auVar115._4_4_ = fStack_314;
  auVar115._0_4_ = local_318;
  auVar115._8_4_ = fStack_310;
  auVar115._12_4_ = fStack_30c;
  auVar125 = maxps(auVar115,_local_328);
  auVar126._4_4_ = fVar163;
  auVar126._0_4_ = fVar162;
  auVar126._8_4_ = fVar198;
  auVar126._12_4_ = fVar201;
  auVar127 = maxps(auVar126,_local_b8);
  auVar116 = maxps(auVar125,auVar127);
  auVar20._4_8_ = auVar127._8_8_;
  auVar20._0_4_ = auVar72._4_4_;
  auVar128._0_8_ = auVar20._0_8_ << 0x20;
  auVar128._8_4_ = auVar72._8_4_;
  auVar128._12_4_ = auVar72._12_4_;
  auVar129._8_8_ = auVar72._8_8_;
  auVar129._0_8_ = auVar128._8_8_;
  auVar125 = minps(auVar72,auVar129);
  auVar21._4_8_ = auVar72._8_8_;
  auVar21._0_4_ = auVar116._4_4_;
  auVar130._0_8_ = auVar21._0_8_ << 0x20;
  auVar130._8_4_ = auVar116._8_4_;
  auVar130._12_4_ = auVar116._12_4_;
  auVar131._8_8_ = auVar116._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar72 = maxps(auVar116,auVar131);
  auVar93._0_8_ = auVar125._0_8_ & 0x7fffffff7fffffff;
  auVar93._8_4_ = auVar125._8_4_ & 0x7fffffff;
  auVar93._12_4_ = auVar125._12_4_ & 0x7fffffff;
  auVar117._0_8_ = auVar72._0_8_ & 0x7fffffff7fffffff;
  auVar117._8_4_ = auVar72._8_4_ & 0x7fffffff;
  auVar117._12_4_ = auVar72._12_4_ & 0x7fffffff;
  auVar72 = maxps(auVar93,auVar117);
  fVar142 = auVar72._4_4_;
  if (auVar72._4_4_ <= auVar72._0_4_) {
    fVar142 = auVar72._0_4_;
  }
  local_2f0 = (ulong)uVar65 + 0xf;
  fVar142 = fVar142 * 9.536743e-07;
  local_148 = fVar142;
  fStack_144 = fVar142;
  fStack_140 = fVar142;
  fStack_13c = fVar142;
  local_158 = -fVar142;
  fStack_154 = -fVar142;
  fStack_150 = -fVar142;
  fStack_14c = -fVar142;
  local_88 = fVar145 - local_318;
  fStack_84 = fVar161 - fStack_314;
  fStack_80 = fVar172 - fStack_310;
  fStack_7c = fVar196 - fStack_30c;
  local_98 = fVar162 - fVar145;
  fStack_94 = fVar163 - fVar161;
  fStack_90 = fVar198 - fVar172;
  fStack_8c = fVar201 - fVar196;
  local_a8 = fVar166 - fVar162;
  fStack_a4 = fVar167 - fVar163;
  fStack_a0 = fVar101 - fVar198;
  fStack_9c = fVar71 - fVar201;
  local_188 = local_388 - local_398;
  fStack_184 = fStack_384 - fStack_394;
  fStack_180 = fStack_380 - fStack_390;
  fStack_17c = fStack_37c - fStack_38c;
  local_198 = local_378 - local_3a8;
  fStack_194 = fStack_374 - fStack_3a4;
  fStack_190 = fStack_370 - fStack_3a0;
  fStack_18c = fStack_36c - fStack_39c;
  local_1a8 = local_3d8 - local_3b8;
  fStack_1a4 = fStack_3d4 - fStack_3b4;
  fStack_1a0 = fStack_3d0 - fStack_3b0;
  fStack_19c = fStack_3cc - fStack_3ac;
  local_1b8 = local_2b8 - local_3c8;
  fStack_1b4 = fStack_2b4 - fStack_3c4;
  fStack_1b0 = fStack_2b0 - fStack_3c0;
  fStack_1ac = fStack_2ac - fStack_3bc;
  local_43c = 0;
  uVar55 = 0;
  local_428 = 0x3f80000000000000;
  local_418 = 0x3f80000000000000;
  local_300 = (ulong)uVar66;
  uStack_270 = local_278;
  local_268 = uStack_330;
  uStack_260 = uStack_330;
  uStack_250 = local_258;
  uStack_240 = local_248;
  uStack_230 = local_238;
  local_228 = local_338;
  uStack_220 = local_338;
  uStack_210 = local_218;
  uStack_200 = local_208;
  do {
    fVar71 = 1.0 - (float)local_428;
    fVar100 = 1.0 - (float)local_428;
    fVar101 = 1.0 - local_428._4_4_;
    fVar102 = 1.0 - local_428._4_4_;
    fVar121 = (float)local_208 * fVar71 + (float)local_248 * (float)local_428;
    fVar166 = local_208._4_4_ * fVar100 + local_248._4_4_ * (float)local_428;
    fVar167 = (float)uStack_200 * fVar101 + (float)uStack_240 * local_428._4_4_;
    fVar172 = uStack_200._4_4_ * fVar102 + uStack_240._4_4_ * local_428._4_4_;
    fVar161 = (float)local_218 * fVar71 + (float)local_258 * (float)local_428;
    fVar212 = local_218._4_4_ * fVar100 + local_258._4_4_ * (float)local_428;
    fVar213 = (float)uStack_210 * fVar101 + (float)uStack_250 * local_428._4_4_;
    fVar223 = uStack_210._4_4_ * fVar102 + uStack_250._4_4_ * local_428._4_4_;
    fVar225 = (float)local_228 * fVar71 + (float)local_268 * (float)local_428;
    fVar240 = local_228._4_4_ * fVar100 + local_268._4_4_ * (float)local_428;
    fVar252 = (float)uStack_220 * fVar101 + (float)uStack_260 * local_428._4_4_;
    fVar254 = uStack_220._4_4_ * fVar102 + uStack_260._4_4_ * local_428._4_4_;
    fVar286 = fVar71 * (float)local_238 + (float)local_428 * (float)local_278;
    fVar288 = fVar100 * local_238._4_4_ + (float)local_428 * local_278._4_4_;
    fVar290 = fVar101 * (float)uStack_230 + local_428._4_4_ * (float)uStack_270;
    fVar292 = fVar102 * uStack_230._4_4_ + local_428._4_4_ * uStack_270._4_4_;
    fVar71 = (local_418._4_4_ - (float)local_418) * 0.11111111;
    fVar304 = (local_418._4_4_ - (float)local_418) * 0.0 + (float)local_418;
    fVar228 = (local_418._4_4_ - (float)local_418) * 0.33333334 + (float)local_418;
    fVar238 = (local_418._4_4_ - (float)local_418) * 0.6666667 + (float)local_418;
    fVar239 = (local_418._4_4_ - (float)local_418) * 1.0 + (float)local_418;
    fVar257 = 1.0 - fVar304;
    fVar268 = 1.0 - fVar228;
    fVar271 = 1.0 - fVar238;
    fVar276 = 1.0 - fVar239;
    fVar122 = fVar161 * fVar257 + fVar225 * fVar304;
    fVar123 = fVar161 * fVar268 + fVar225 * fVar228;
    fVar140 = fVar161 * fVar271 + fVar225 * fVar238;
    fVar145 = fVar161 * fVar276 + fVar225 * fVar239;
    fVar196 = fVar212 * fVar257 + fVar240 * fVar304;
    fVar198 = fVar212 * fVar268 + fVar240 * fVar228;
    fVar201 = fVar212 * fVar271 + fVar240 * fVar238;
    fVar211 = fVar212 * fVar276 + fVar240 * fVar239;
    fVar100 = (fVar121 * fVar257 + fVar161 * fVar304) * fVar257 + fVar304 * fVar122;
    fVar101 = (fVar121 * fVar268 + fVar161 * fVar228) * fVar268 + fVar228 * fVar123;
    fVar102 = (fVar121 * fVar271 + fVar161 * fVar238) * fVar271 + fVar238 * fVar140;
    fVar121 = (fVar121 * fVar276 + fVar161 * fVar239) * fVar276 + fVar239 * fVar145;
    fVar161 = (fVar166 * fVar257 + fVar212 * fVar304) * fVar257 + fVar304 * fVar196;
    fVar162 = (fVar166 * fVar268 + fVar212 * fVar228) * fVar268 + fVar228 * fVar198;
    fVar163 = (fVar166 * fVar271 + fVar212 * fVar238) * fVar271 + fVar238 * fVar201;
    fVar166 = (fVar166 * fVar276 + fVar212 * fVar239) * fVar276 + fVar239 * fVar211;
    fVar122 = fVar122 * fVar257 + (fVar225 * fVar257 + fVar286 * fVar304) * fVar304;
    fVar123 = fVar123 * fVar268 + (fVar225 * fVar268 + fVar286 * fVar228) * fVar228;
    fVar140 = fVar140 * fVar271 + (fVar225 * fVar271 + fVar286 * fVar238) * fVar238;
    fVar145 = fVar145 * fVar276 + (fVar225 * fVar276 + fVar286 * fVar239) * fVar239;
    fVar196 = fVar196 * fVar257 + (fVar240 * fVar257 + fVar288 * fVar304) * fVar304;
    fVar198 = fVar198 * fVar268 + (fVar240 * fVar268 + fVar288 * fVar228) * fVar228;
    fVar201 = fVar201 * fVar271 + (fVar240 * fVar271 + fVar288 * fVar238) * fVar238;
    fVar211 = fVar211 * fVar276 + (fVar240 * fVar276 + fVar288 * fVar239) * fVar239;
    local_2a8 = fVar257 * fVar100 + fVar304 * fVar122;
    fStack_2a4 = fVar268 * fVar101 + fVar228 * fVar123;
    fStack_2a0 = fVar271 * fVar102 + fVar238 * fVar140;
    fStack_29c = fVar276 * fVar121 + fVar239 * fVar145;
    local_298 = fVar257 * fVar161 + fVar304 * fVar196;
    fStack_294 = fVar268 * fVar162 + fVar228 * fVar198;
    fStack_290 = fVar271 * fVar163 + fVar238 * fVar201;
    fStack_28c = fVar276 * fVar166 + fVar239 * fVar211;
    fVar123 = (fVar123 - fVar101) * 3.0 * fVar71;
    fVar102 = (fVar140 - fVar102) * 3.0 * fVar71;
    fVar121 = (fVar145 - fVar121) * 3.0 * fVar71;
    fVar140 = (fVar198 - fVar162) * 3.0 * fVar71;
    fVar145 = (fVar201 - fVar163) * 3.0 * fVar71;
    fVar162 = (fVar211 - fVar166) * 3.0 * fVar71;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_348._0_4_ = local_2a8 + (fVar122 - fVar100) * 3.0 * fVar71;
    local_348._4_4_ = fStack_2a4 + fVar123;
    fStack_340 = fStack_2a0 + fVar102;
    fStack_33c = fStack_29c + fVar121;
    fVar100 = local_298 + (fVar196 - fVar161) * 3.0 * fVar71;
    fVar101 = fStack_294 + fVar140;
    fStack_430 = fStack_290 + fVar145;
    fStack_42c = fStack_28c + fVar162;
    local_288._0_4_ = fStack_2a4 - fVar123;
    local_288._4_4_ = fStack_2a0 - fVar102;
    local_288._8_4_ = fStack_29c - fVar121;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar140;
    local_d8._4_4_ = fStack_290 - fVar145;
    local_d8._8_4_ = fStack_28c - fVar162;
    local_d8._12_4_ = 0;
    fVar102 = fVar213 * fVar257 + fVar252 * fVar304;
    fVar121 = fVar213 * fVar268 + fVar252 * fVar228;
    fVar122 = fVar213 * fVar271 + fVar252 * fVar238;
    fVar123 = fVar213 * fVar276 + fVar252 * fVar239;
    fVar140 = fVar223 * fVar257 + fVar254 * fVar304;
    fVar145 = fVar223 * fVar268 + fVar254 * fVar228;
    fVar161 = fVar223 * fVar271 + fVar254 * fVar238;
    fVar162 = fVar223 * fVar276 + fVar254 * fVar239;
    fVar196 = (fVar167 * fVar257 + fVar213 * fVar304) * fVar257 + fVar304 * fVar102;
    fVar198 = (fVar167 * fVar268 + fVar213 * fVar228) * fVar268 + fVar228 * fVar121;
    fVar201 = (fVar167 * fVar271 + fVar213 * fVar238) * fVar271 + fVar238 * fVar122;
    fVar211 = (fVar167 * fVar276 + fVar213 * fVar239) * fVar276 + fVar239 * fVar123;
    fVar163 = (fVar172 * fVar257 + fVar223 * fVar304) * fVar257 + fVar304 * fVar140;
    fVar166 = (fVar172 * fVar268 + fVar223 * fVar228) * fVar268 + fVar228 * fVar145;
    fVar167 = (fVar172 * fVar271 + fVar223 * fVar238) * fVar271 + fVar238 * fVar161;
    fVar172 = (fVar172 * fVar276 + fVar223 * fVar239) * fVar276 + fVar239 * fVar162;
    fVar102 = fVar102 * fVar257 + (fVar252 * fVar257 + fVar290 * fVar304) * fVar304;
    fVar121 = fVar121 * fVar268 + (fVar252 * fVar268 + fVar290 * fVar228) * fVar228;
    fVar122 = fVar122 * fVar271 + (fVar252 * fVar271 + fVar290 * fVar238) * fVar238;
    fVar123 = fVar123 * fVar276 + (fVar252 * fVar276 + fVar290 * fVar239) * fVar239;
    fVar212 = fVar140 * fVar257 + (fVar254 * fVar257 + fVar292 * fVar304) * fVar304;
    fVar213 = fVar145 * fVar268 + (fVar254 * fVar268 + fVar292 * fVar228) * fVar228;
    fVar223 = fVar161 * fVar271 + (fVar254 * fVar271 + fVar292 * fVar238) * fVar238;
    fVar225 = fVar162 * fVar276 + (fVar254 * fVar276 + fVar292 * fVar239) * fVar239;
    fVar140 = fVar257 * fVar196 + fVar304 * fVar102;
    fVar145 = fVar268 * fVar198 + fVar228 * fVar121;
    fVar161 = fVar271 * fVar201 + fVar238 * fVar122;
    fVar162 = fVar276 * fVar211 + fVar239 * fVar123;
    fVar240 = fVar257 * fVar163 + fVar304 * fVar212;
    fVar252 = fVar268 * fVar166 + fVar228 * fVar213;
    fVar254 = fVar271 * fVar167 + fVar238 * fVar223;
    fVar304 = fVar276 * fVar172 + fVar239 * fVar225;
    fVar121 = (fVar121 - fVar198) * 3.0 * fVar71;
    fVar122 = (fVar122 - fVar201) * 3.0 * fVar71;
    fVar123 = (fVar123 - fVar211) * 3.0 * fVar71;
    fVar166 = (fVar213 - fVar166) * 3.0 * fVar71;
    fVar167 = (fVar223 - fVar167) * 3.0 * fVar71;
    fVar172 = (fVar225 - fVar172) * 3.0 * fVar71;
    local_f8._4_4_ = fVar161;
    local_f8._0_4_ = fVar145;
    local_f8._8_4_ = fVar162;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar254;
    local_118._0_4_ = fVar252;
    local_118._8_4_ = fVar304;
    local_118._12_4_ = 0;
    local_358 = fVar140 + (fVar102 - fVar196) * 3.0 * fVar71;
    fStack_354 = fVar145 + fVar121;
    fStack_350 = fVar161 + fVar122;
    fStack_34c = fVar162 + fVar123;
    local_108 = fVar240 + (fVar212 - fVar163) * 3.0 * fVar71;
    fStack_104 = fVar252 + fVar166;
    fStack_100 = fVar254 + fVar167;
    fStack_fc = fVar304 + fVar172;
    local_138._0_4_ = fVar145 - fVar121;
    local_138._4_4_ = fVar161 - fVar122;
    local_138._8_4_ = fVar162 - fVar123;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar252 - fVar166;
    local_128._4_4_ = fVar254 - fVar167;
    local_128._8_4_ = fVar304 - fVar172;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar123 = (fVar145 - fStack_2a4) + (fVar140 - local_2a8);
    fVar163 = (fVar161 - fStack_2a0) + (fVar145 - fStack_2a4);
    fVar166 = (fVar162 - fStack_29c) + (fVar161 - fStack_2a0);
    fVar167 = (fVar162 - fStack_29c) + 0.0;
    fVar71 = (fVar252 - fStack_294) + (fVar240 - local_298);
    fVar102 = (fVar254 - fStack_290) + (fVar252 - fStack_294);
    fVar121 = (fVar304 - fStack_28c) + (fVar254 - fStack_290);
    fVar122 = (fVar304 - fStack_28c) + 0.0;
    auVar190._0_8_ =
         CONCAT44(fStack_294 * fVar163 - fStack_2a4 * fVar102,
                  local_298 * fVar123 - local_2a8 * fVar71);
    auVar190._8_4_ = fStack_290 * fVar166 - fStack_2a0 * fVar121;
    auVar190._12_4_ = fStack_28c * fVar167 - fStack_29c * fVar122;
    auVar132._0_4_ = fVar100 * fVar123 - (float)local_348._0_4_ * fVar71;
    auVar132._4_4_ = fVar101 * fVar163 - (float)local_348._4_4_ * fVar102;
    auVar132._8_4_ = fStack_430 * fVar166 - fStack_340 * fVar121;
    auVar132._12_4_ = fStack_42c * fVar167 - fStack_33c * fVar122;
    auVar151._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar163 - fVar102 * local_288._4_4_,
                  local_d8._0_4_ * fVar123 - fVar71 * local_288._0_4_);
    auVar151._8_4_ = local_d8._8_4_ * fVar166 - fVar121 * local_288._8_4_;
    auVar151._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
    auVar324._0_4_ = fVar123 * fStack_294 - fVar71 * fStack_2a4;
    auVar324._4_4_ = fVar163 * fStack_290 - fVar102 * fStack_2a0;
    auVar324._8_4_ = fVar166 * fStack_28c - fVar121 * fStack_29c;
    auVar324._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
    auVar94._0_8_ =
         CONCAT44(fVar252 * fVar163 - fVar145 * fVar102,fVar240 * fVar123 - fVar140 * fVar71);
    auVar94._8_4_ = fVar254 * fVar166 - fVar161 * fVar121;
    auVar94._12_4_ = fVar304 * fVar167 - fVar162 * fVar122;
    auVar283._0_4_ = local_108 * fVar123 - local_358 * fVar71;
    auVar283._4_4_ = fStack_104 * fVar163 - fStack_354 * fVar102;
    auVar283._8_4_ = fStack_100 * fVar166 - fStack_350 * fVar121;
    auVar283._12_4_ = fStack_fc * fVar167 - fStack_34c * fVar122;
    auVar229._0_8_ =
         CONCAT44(local_128._4_4_ * fVar163 - fVar102 * local_138._4_4_,
                  local_128._0_4_ * fVar123 - fVar71 * local_138._0_4_);
    auVar229._8_4_ = local_128._8_4_ * fVar166 - fVar121 * local_138._8_4_;
    auVar229._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
    auVar264._0_4_ = fVar123 * fVar252 - fVar71 * fVar145;
    auVar264._4_4_ = fVar163 * fVar254 - fVar102 * fVar161;
    auVar264._8_4_ = fVar166 * fVar304 - fVar121 * fVar162;
    auVar264._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
    auVar316._8_4_ = auVar190._8_4_;
    auVar316._0_8_ = auVar190._0_8_;
    auVar316._12_4_ = auVar190._12_4_;
    auVar116 = minps(auVar316,auVar132);
    auVar125 = maxps(auVar190,auVar132);
    auVar133._8_4_ = auVar151._8_4_;
    auVar133._0_8_ = auVar151._0_8_;
    auVar133._12_4_ = auVar151._12_4_;
    auVar72 = minps(auVar133,auVar324);
    auVar317 = minps(auVar116,auVar72);
    auVar72 = maxps(auVar151,auVar324);
    auVar127 = maxps(auVar125,auVar72);
    auVar134._8_4_ = auVar94._8_4_;
    auVar134._0_8_ = auVar94._0_8_;
    auVar134._12_4_ = auVar94._12_4_;
    auVar125 = minps(auVar134,auVar283);
    auVar72 = maxps(auVar94,auVar283);
    auVar152._8_4_ = auVar229._8_4_;
    auVar152._0_8_ = auVar229._0_8_;
    auVar152._12_4_ = auVar229._12_4_;
    auVar116 = minps(auVar152,auVar264);
    auVar125 = minps(auVar125,auVar116);
    auVar116 = minps(auVar317,auVar125);
    auVar125 = maxps(auVar229,auVar264);
    auVar72 = maxps(auVar72,auVar125);
    auVar72 = maxps(auVar127,auVar72);
    bVar64 = auVar116._4_4_ <= fStack_144;
    bVar18 = auVar116._8_4_ <= fStack_140;
    bVar19 = auVar116._12_4_ <= fStack_13c;
    auVar52._4_4_ = -(uint)bVar18;
    auVar52._0_4_ = -(uint)bVar64;
    auVar52._8_4_ = -(uint)bVar19;
    auVar52._12_4_ = 0;
    auVar318 = auVar52 << 0x20;
    auVar191._0_4_ =
         -(uint)(local_158 <= auVar72._0_4_ && auVar116._0_4_ <= local_148) & local_168._0_4_;
    auVar191._4_4_ = -(uint)(fStack_154 <= auVar72._4_4_ && bVar64) & local_168._4_4_;
    auVar191._8_4_ = -(uint)(fStack_150 <= auVar72._8_4_ && bVar18) & local_168._8_4_;
    auVar191._12_4_ = -(uint)(fStack_14c <= auVar72._12_4_ && bVar19) & local_168._12_4_;
    iVar59 = movmskps((int)uVar60,auVar191);
    uVar56 = 0;
    if (iVar59 != 0) {
      fVar123 = (fVar145 - fVar140) + (fStack_2a4 - local_2a8);
      fVar163 = (fVar161 - fVar145) + (fStack_2a0 - fStack_2a4);
      fVar166 = (fVar162 - fVar161) + (fStack_29c - fStack_2a0);
      fVar167 = (0.0 - fVar162) + (0.0 - fStack_29c);
      fVar71 = (fVar252 - fVar240) + (fStack_294 - local_298);
      fVar102 = (fVar254 - fVar252) + (fStack_290 - fStack_294);
      fVar121 = (fVar304 - fVar254) + (fStack_28c - fStack_290);
      fVar122 = (0.0 - fVar304) + (0.0 - fStack_28c);
      auVar325._0_8_ =
           CONCAT44(fStack_294 * fVar163 - fStack_2a4 * fVar102,
                    local_298 * fVar123 - local_2a8 * fVar71);
      auVar325._8_4_ = fStack_290 * fVar166 - fStack_2a0 * fVar121;
      auVar325._12_4_ = fStack_28c * fVar167 - fStack_29c * fVar122;
      auVar135._0_4_ = fVar100 * fVar123 - (float)local_348._0_4_ * fVar71;
      auVar135._4_4_ = fVar101 * fVar163 - (float)local_348._4_4_ * fVar102;
      auVar135._8_4_ = fStack_430 * fVar166 - fStack_340 * fVar121;
      auVar135._12_4_ = fStack_42c * fVar167 - fStack_33c * fVar122;
      auVar318._0_4_ = local_288._0_4_ * fVar71;
      auVar318._4_4_ = local_288._4_4_ * fVar102;
      auVar318._8_4_ = local_288._8_4_ * fVar121;
      auVar318._12_4_ = fVar122 * 0.0;
      auVar220._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar163 - auVar318._4_4_,
                    local_d8._0_4_ * fVar123 - auVar318._0_4_);
      auVar220._8_4_ = local_d8._8_4_ * fVar166 - auVar318._8_4_;
      auVar220._12_4_ = fVar167 * 0.0 - auVar318._12_4_;
      auVar153._0_4_ = fStack_294 * fVar123 - fStack_2a4 * fVar71;
      auVar153._4_4_ = fStack_290 * fVar163 - fStack_2a0 * fVar102;
      auVar153._8_4_ = fStack_28c * fVar166 - fStack_29c * fVar121;
      auVar153._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
      auVar307._0_8_ =
           CONCAT44(fVar252 * fVar163 - fVar145 * fVar102,fVar240 * fVar123 - fVar140 * fVar71);
      auVar307._8_4_ = fVar254 * fVar166 - fVar161 * fVar121;
      auVar307._12_4_ = fVar304 * fVar167 - fVar162 * fVar122;
      auVar164._0_4_ = local_108 * fVar123 - local_358 * fVar71;
      auVar164._4_4_ = fStack_104 * fVar163 - fStack_354 * fVar102;
      auVar164._8_4_ = fStack_100 * fVar166 - fStack_350 * fVar121;
      auVar164._12_4_ = fStack_fc * fVar167 - fStack_34c * fVar122;
      auVar284._0_8_ =
           CONCAT44(local_128._4_4_ * fVar163 - local_138._4_4_ * fVar102,
                    local_128._0_4_ * fVar123 - local_138._0_4_ * fVar71);
      auVar284._8_4_ = local_128._8_4_ * fVar166 - local_138._8_4_ * fVar121;
      auVar284._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
      auVar265._0_4_ = fVar123 * fVar252 - fVar71 * fVar145;
      auVar265._4_4_ = fVar163 * fVar254 - fVar102 * fVar161;
      auVar265._8_4_ = fVar166 * fVar304 - fVar121 * fVar162;
      auVar265._12_4_ = fVar167 * 0.0 - fVar122 * 0.0;
      auVar95._8_4_ = auVar325._8_4_;
      auVar95._0_8_ = auVar325._0_8_;
      auVar95._12_4_ = auVar325._12_4_;
      auVar72 = minps(auVar95,auVar135);
      auVar116 = maxps(auVar325,auVar135);
      auVar136._8_4_ = auVar220._8_4_;
      auVar136._0_8_ = auVar220._0_8_;
      auVar136._12_4_ = auVar220._12_4_;
      auVar125 = minps(auVar136,auVar153);
      auVar72 = minps(auVar72,auVar125);
      auVar125 = maxps(auVar220,auVar153);
      auVar317 = maxps(auVar116,auVar125);
      auVar137._8_4_ = auVar307._8_4_;
      auVar137._0_8_ = auVar307._0_8_;
      auVar137._12_4_ = auVar307._12_4_;
      auVar125 = minps(auVar137,auVar164);
      auVar127 = maxps(auVar307,auVar164);
      auVar154._8_4_ = auVar284._8_4_;
      auVar154._0_8_ = auVar284._0_8_;
      auVar154._12_4_ = auVar284._12_4_;
      auVar116 = minps(auVar154,auVar265);
      auVar125 = minps(auVar125,auVar116);
      auVar72 = minps(auVar72,auVar125);
      auVar125 = maxps(auVar284,auVar265);
      auVar125 = maxps(auVar127,auVar125);
      auVar125 = maxps(auVar317,auVar125);
      auVar326._0_4_ =
           -(uint)(local_158 <= auVar125._0_4_ && auVar72._0_4_ <= local_148) & auVar191._0_4_;
      auVar326._4_4_ =
           -(uint)(fStack_154 <= auVar125._4_4_ && auVar72._4_4_ <= fStack_144) & auVar191._4_4_;
      auVar326._8_4_ =
           -(uint)(fStack_150 <= auVar125._8_4_ && auVar72._8_4_ <= fStack_140) & auVar191._8_4_;
      auVar326._12_4_ =
           -(uint)(fStack_14c <= auVar125._12_4_ && auVar72._12_4_ <= fStack_13c) & auVar191._12_4_;
      uVar66 = movmskps(0,auVar326);
      uVar56 = (ulong)uVar66;
    }
    if ((uint)uVar56 != 0) {
      auStack_1f8[uVar55] = (uint)uVar56;
      *(undefined8 *)(afStack_78 + uVar55 * 2) = local_418;
      auStack_58[uVar55] = local_428;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        if (local_43c != 0) {
          return local_43d;
        }
        fVar142 = ray->tfar;
        auVar120._4_4_ = -(uint)(fStack_174 <= fVar142);
        auVar120._0_4_ = -(uint)(local_178 <= fVar142);
        auVar120._8_4_ = -(uint)(fStack_170 <= fVar142);
        auVar120._12_4_ = -(uint)(fStack_16c <= fVar142);
        uVar66 = movmskps((int)uVar56,auVar120);
        uVar65 = uVar65 & (uint)local_2f0 & uVar66;
        local_43d = uVar65 != 0;
        if (!local_43d) {
          return local_43d;
        }
        goto LAB_00c347b5;
      }
      uVar68 = (int)uVar55 - 1;
      uVar57 = (ulong)uVar68;
      uVar66 = auStack_1f8[uVar57];
      local_428 = auStack_58[uVar57];
      uVar56 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
        }
      }
      uVar66 = uVar66 - 1 & uVar66;
      auStack_1f8[uVar57] = uVar66;
      if (uVar66 == 0) {
        uVar55 = (ulong)uVar68;
      }
      uVar61 = uVar56 + 1;
      uVar60 = uVar61;
      if ((long)uVar61 < 0) {
        uVar60 = (ulong)((uint)uVar61 & 1) | uVar61 >> 1;
      }
      fVar71 = afStack_78[uVar57 * 2];
      fVar100 = *(float *)((long)auStack_58 + uVar57 * 8 + -0x1c);
      fVar101 = fVar71 * (1.0 - (float)uVar56 * 0.33333334) + fVar100 * (float)uVar56 * 0.33333334;
      fVar102 = fVar71 * (1.0 - (float)uVar61 * 0.33333334) + fVar100 * (float)uVar61 * 0.33333334;
      fVar121 = fVar71 * 0.0 + fVar100 * 0.0;
      fVar100 = fVar71 * 0.0 + fVar100 * 0.0;
      fVar71 = fVar102 - fVar101;
      local_418 = CONCAT44(fVar102,fVar101);
      if (0.16666667 <= fVar71) break;
      fVar122 = (float)local_428;
      fVar123 = (float)((ulong)local_428 >> 0x20);
      fVar140 = 1.0 - fVar122;
      fVar145 = 1.0 - fVar122;
      fVar196 = 1.0 - fVar123;
      fVar198 = 1.0 - fVar123;
      fVar161 = (float)local_208 * fVar140 + (float)local_248 * fVar122;
      fVar162 = local_208._4_4_ * fVar145 + local_248._4_4_ * fVar122;
      fVar163 = (float)uStack_200 * fVar196 + (float)uStack_240 * fVar123;
      fVar166 = uStack_200._4_4_ * fVar198 + uStack_240._4_4_ * fVar123;
      fVar201 = (float)local_218 * fVar140 + (float)local_258 * fVar122;
      fVar211 = local_218._4_4_ * fVar145 + local_258._4_4_ * fVar122;
      fVar212 = (float)uStack_210 * fVar196 + (float)uStack_250 * fVar123;
      fVar213 = uStack_210._4_4_ * fVar198 + uStack_250._4_4_ * fVar123;
      fVar223 = (float)local_228 * fVar140 + (float)local_268 * fVar122;
      fVar240 = local_228._4_4_ * fVar145 + local_268._4_4_ * fVar122;
      fVar254 = (float)uStack_220 * fVar196 + (float)uStack_260 * fVar123;
      fVar228 = uStack_220._4_4_ * fVar198 + uStack_260._4_4_ * fVar123;
      fVar167 = (fVar140 * (float)local_238 + fVar122 * (float)local_278) - fVar223;
      fVar172 = (fVar145 * local_238._4_4_ + fVar122 * local_278._4_4_) - fVar240;
      fVar196 = (fVar196 * (float)uStack_230 + fVar123 * (float)uStack_270) - fVar254;
      fVar198 = (fVar198 * uStack_230._4_4_ + fVar123 * uStack_270._4_4_) - fVar228;
      fVar122 = fVar101 * (fVar223 - fVar201) + fVar201;
      fVar123 = fVar101 * (fVar240 - fVar211) + fVar211;
      fVar140 = fVar101 * (fVar254 - fVar212) + fVar212;
      fVar145 = fVar101 * (fVar228 - fVar213) + fVar213;
      fVar225 = (fVar223 - fVar201) * fVar102 + fVar201;
      fVar252 = (fVar240 - fVar211) * fVar102 + fVar211;
      fVar304 = (fVar254 - fVar212) * fVar102 + fVar212;
      fVar238 = (fVar228 - fVar213) * fVar102 + fVar213;
      fVar239 = fVar101 * (fVar201 - fVar161) + fVar161;
      fVar257 = fVar101 * (fVar211 - fVar162) + fVar162;
      fVar268 = fVar101 * (fVar212 - fVar163) + fVar163;
      fVar271 = fVar101 * (fVar213 - fVar166) + fVar166;
      fVar239 = (fVar122 - fVar239) * fVar101 + fVar239;
      fVar257 = (fVar123 - fVar257) * fVar101 + fVar257;
      fVar268 = (fVar140 - fVar268) * fVar101 + fVar268;
      fVar271 = (fVar145 - fVar271) * fVar101 + fVar271;
      fVar122 = (((fVar101 * fVar167 + fVar223) - fVar122) * fVar101 + fVar122) - fVar239;
      fVar123 = (((fVar101 * fVar172 + fVar240) - fVar123) * fVar101 + fVar123) - fVar257;
      fVar140 = (((fVar101 * fVar196 + fVar254) - fVar140) * fVar101 + fVar140) - fVar268;
      fVar145 = (((fVar101 * fVar198 + fVar228) - fVar145) * fVar101 + fVar145) - fVar271;
      auVar96._0_4_ = fVar101 * fVar122 + fVar239;
      auVar96._4_4_ = fVar101 * fVar123 + fVar257;
      auVar96._8_4_ = fVar101 * fVar140 + fVar268;
      auVar96._12_4_ = fVar101 * fVar145 + fVar271;
      fVar161 = (fVar201 - fVar161) * fVar102 + fVar161;
      fVar162 = (fVar211 - fVar162) * fVar102 + fVar162;
      fVar163 = (fVar212 - fVar163) * fVar102 + fVar163;
      fVar166 = (fVar213 - fVar166) * fVar102 + fVar166;
      fVar161 = (fVar225 - fVar161) * fVar102 + fVar161;
      fVar162 = (fVar252 - fVar162) * fVar102 + fVar162;
      fVar163 = (fVar304 - fVar163) * fVar102 + fVar163;
      fVar166 = (fVar238 - fVar166) * fVar102 + fVar166;
      fVar201 = (((fVar167 * fVar102 + fVar223) - fVar225) * fVar102 + fVar225) - fVar161;
      fVar211 = (((fVar172 * fVar102 + fVar240) - fVar252) * fVar102 + fVar252) - fVar162;
      fVar212 = (((fVar196 * fVar102 + fVar254) - fVar304) * fVar102 + fVar304) - fVar163;
      fVar213 = (((fVar198 * fVar102 + fVar228) - fVar238) * fVar102 + fVar238) - fVar166;
      fVar161 = fVar102 * fVar201 + fVar161;
      fVar162 = fVar102 * fVar211 + fVar162;
      fVar163 = fVar102 * fVar212 + fVar163;
      fVar166 = fVar102 * fVar213 + fVar166;
      fVar223 = fVar71 * 0.33333334;
      fVar167 = fVar122 * 3.0 * fVar223 + auVar96._0_4_;
      fVar172 = fVar123 * 3.0 * fVar223 + auVar96._4_4_;
      fVar196 = fVar140 * 3.0 * fVar223 + auVar96._8_4_;
      fVar198 = fVar145 * 3.0 * fVar223 + auVar96._12_4_;
      fVar201 = fVar161 - fVar223 * fVar201 * 3.0;
      fVar211 = fVar162 - fVar223 * fVar211 * 3.0;
      fVar212 = fVar163 - fVar223 * fVar212 * 3.0;
      fVar213 = fVar166 - fVar223 * fVar213 * 3.0;
      auVar22._4_8_ = auVar318._8_8_;
      auVar22._0_4_ = auVar96._4_4_;
      auVar319._0_8_ = auVar22._0_8_ << 0x20;
      auVar319._8_4_ = auVar96._8_4_;
      auVar319._12_4_ = auVar96._12_4_;
      auVar320._8_8_ = auVar96._8_8_;
      auVar320._0_8_ = auVar319._8_8_;
      fVar252 = (fVar163 - fVar161) + (auVar96._8_4_ - auVar96._0_4_);
      fVar254 = (fVar166 - fVar162) + (auVar96._12_4_ - auVar96._4_4_);
      auVar230._0_4_ = fVar254 * fVar162;
      auVar230._4_4_ = fVar254 * fVar162;
      auVar230._8_4_ = fVar254 * fVar166;
      auVar230._12_4_ = fVar254 * fVar166;
      fVar122 = auVar96._0_4_ * fVar252 + auVar96._4_4_ * fVar254;
      fVar123 = auVar96._8_4_ * fVar252 + auVar96._12_4_ * fVar254;
      fVar304 = fVar167 * fVar252 + fVar172 * fVar254;
      fVar228 = fVar196 * fVar252 + fVar198 * fVar254;
      fVar223 = fVar201 * fVar252 + fVar211 * fVar254;
      auVar246._4_4_ = fVar211 * fVar252 + fVar211 * fVar254;
      auVar246._0_4_ = fVar223;
      fVar225 = fVar212 * fVar252 + fVar213 * fVar254;
      fVar140 = fVar252 * fVar161 + auVar230._0_4_;
      fVar240 = fVar252 * fVar163 + auVar230._8_4_;
      auVar23._4_8_ = auVar230._8_8_;
      auVar23._0_4_ = fVar172 * fVar252 + fVar172 * fVar254;
      auVar231._0_8_ = auVar23._0_8_ << 0x20;
      auVar231._8_4_ = fVar228;
      auVar231._12_4_ = fVar198 * fVar252 + fVar198 * fVar254;
      fVar145 = fVar304;
      if (fVar304 <= fVar122) {
        fVar145 = fVar122;
        fVar122 = fVar304;
      }
      auVar232._8_8_ = auVar231._8_8_;
      auVar232._0_8_ = auVar232._8_8_;
      auVar246._8_4_ = fVar225;
      auVar246._12_4_ = fVar213 * fVar252 + fVar213 * fVar254;
      if (fVar140 <= fVar223) {
        auVar246._0_4_ = fVar140;
      }
      if (auVar246._0_4_ <= fVar122) {
        fVar122 = auVar246._0_4_;
      }
      auVar24._4_8_ = auVar246._8_8_;
      auVar24._0_4_ = fVar252 * fVar162 + auVar230._4_4_;
      auVar247._0_8_ = auVar24._0_8_ << 0x20;
      auVar247._8_4_ = fVar240;
      auVar247._12_4_ = fVar252 * fVar166 + auVar230._12_4_;
      if (fVar140 <= fVar223) {
        fVar140 = fVar223;
      }
      auVar248._8_8_ = auVar247._8_8_;
      auVar248._0_8_ = auVar248._8_8_;
      if (fVar140 <= fVar145) {
        fVar140 = fVar145;
      }
      if (fVar228 <= fVar123) {
        auVar232._0_4_ = fVar123;
        fVar123 = fVar228;
      }
      fVar145 = fVar225;
      if (fVar240 <= fVar225) {
        fVar145 = fVar240;
      }
      if (fVar145 <= fVar123) {
        fVar123 = fVar145;
      }
      if (fVar240 <= fVar225) {
        auVar248._0_4_ = fVar225;
      }
      if (auVar248._0_4_ <= auVar232._0_4_) {
        auVar248._0_4_ = auVar232._0_4_;
      }
      uVar60 = CONCAT71((int7)(uVar60 >> 8),fVar71 < 0.001);
      bVar64 = 3 < (uint)uVar55;
      uVar25 = (undefined3)(uVar68 >> 8);
      uVar56 = (ulong)CONCAT31(uVar25,bVar64);
      fVar145 = auVar248._0_4_;
      if ((0.0001 <= fVar122) || (fVar145 <= -0.0001)) {
        if ((-0.0001 < fVar140 && fVar123 < 0.0001) ||
           ((fVar122 < 0.0001 && -0.0001 < fVar140 || (fVar123 < 0.0001 && -0.0001 < fVar145))))
        goto LAB_00c35f77;
        bVar18 = true;
        auVar318 = auVar320;
      }
      else {
LAB_00c35f77:
        local_428 = CONCAT44(fVar166,fVar163);
        bVar64 = bVar64 || fVar71 < 0.001;
        uVar56 = (ulong)CONCAT31(uVar25,bVar64);
        fVar240 = (float)(~-(uint)(fVar122 < 0.0) & 0x3f800000 | -(uint)(fVar122 < 0.0) & 0xbf800000
                         );
        fVar225 = (float)(~-(uint)(fVar140 < 0.0) & 0x3f800000 | -(uint)(fVar140 < 0.0) & 0xbf800000
                         );
        fVar223 = 0.0;
        if ((fVar240 == fVar225) && (!NAN(fVar240) && !NAN(fVar225))) {
          fVar223 = INFINITY;
        }
        fVar252 = 0.0;
        if ((fVar240 == fVar225) && (!NAN(fVar240) && !NAN(fVar225))) {
          fVar252 = -INFINITY;
        }
        fVar254 = (float)(~-(uint)(fVar123 < 0.0) & 0x3f800000 | -(uint)(fVar123 < 0.0) & 0xbf800000
                         );
        if ((fVar240 != fVar254) || (fVar304 = fVar252, NAN(fVar240) || NAN(fVar254))) {
          if ((fVar123 != fVar122) || (NAN(fVar123) || NAN(fVar122))) {
            fVar123 = -fVar122 / (fVar123 - fVar122);
            fVar123 = (1.0 - fVar123) * 0.0 + fVar123;
            fVar304 = fVar123;
          }
          else {
            fVar123 = INFINITY;
            if ((fVar122 == 0.0) && (fVar123 = INFINITY, !NAN(fVar122))) {
              fVar123 = 0.0;
            }
            fVar304 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar122 == 0.0) & 1) * 4);
          }
          if (fVar123 <= fVar223) {
            fVar223 = fVar123;
          }
          if (fVar304 <= fVar252) {
            fVar304 = fVar252;
          }
        }
        uVar60 = (ulong)(fVar145 < 0.0);
        fVar122 = *(float *)(&DAT_01ff1ecc + uVar60 * 4);
        if ((fVar225 != fVar122) || (fVar123 = fVar304, NAN(fVar225) || NAN(fVar122))) {
          if ((fVar145 != fVar140) || (NAN(fVar145) || NAN(fVar140))) {
            fVar145 = -fVar140 / (fVar145 - fVar140);
            fVar145 = (1.0 - fVar145) * 0.0 + fVar145;
            fVar123 = fVar145;
          }
          else {
            fVar145 = INFINITY;
            if ((fVar140 == 0.0) && (fVar145 = INFINITY, !NAN(fVar140))) {
              fVar145 = 0.0;
            }
            uVar60 = (ulong)(-(uint)(fVar140 == 0.0) & 1);
            fVar123 = *(float *)(&DAT_01ff1ec4 + uVar60 * 4);
          }
          if (fVar145 <= fVar223) {
            fVar223 = fVar145;
          }
          if (fVar123 <= fVar304) {
            fVar123 = fVar304;
          }
        }
        if ((fVar254 != fVar122) || (NAN(fVar254) || NAN(fVar122))) {
          fVar223 = (float)(~-(uint)(fVar223 < 1.0) & 0x3f800000 |
                           (uint)fVar223 & -(uint)(fVar223 < 1.0));
          fVar123 = (float)(~-(uint)(fVar123 < 1.0) & (uint)fVar123 |
                           -(uint)(fVar123 < 1.0) & 0x3f800000);
        }
        fVar140 = SUB164(ZEXT816(0x3f80000000000000),4);
        uVar66 = -(uint)(fVar123 < fVar140);
        fVar223 = (float)(~-(uint)(fVar223 < 0.0) & (uint)fVar223);
        fVar122 = (float)(~uVar66 & 0x3f800000 | (uint)fVar123 & uVar66);
        bVar18 = true;
        auVar318 = ZEXT816(0x3f80000000000000);
        _local_348 = auVar320;
        if (fVar223 <= fVar122) {
          fVar223 = fVar223 + -0.1;
          fVar122 = fVar122 + 0.1;
          uVar66 = -(uint)(fVar122 < fVar140);
          fVar223 = (float)(~-(uint)(fVar223 < 0.0) & (uint)fVar223);
          fVar238 = (float)(~uVar66 & 0x3f800000 | (uint)fVar122 & uVar66);
          fVar252 = 1.0 - fVar223;
          fVar254 = 1.0 - fVar223;
          fVar304 = 1.0 - fVar238;
          fVar228 = 1.0 - fVar238;
          fVar122 = auVar96._0_4_ * fVar252 + auVar96._8_4_ * fVar223;
          fVar123 = auVar96._4_4_ * fVar254 + auVar96._12_4_ * fVar223;
          fVar140 = auVar96._0_4_ * fVar304 + auVar96._8_4_ * fVar238;
          fVar145 = auVar96._4_4_ * fVar228 + auVar96._12_4_ * fVar238;
          fVar225 = fVar167 * fVar252 + fVar196 * fVar223;
          fVar240 = fVar172 * fVar254 + fVar198 * fVar223;
          fVar167 = fVar167 * fVar304 + fVar196 * fVar238;
          fVar172 = fVar172 * fVar228 + fVar198 * fVar238;
          fVar196 = fVar201 * fVar252 + fVar212 * fVar223;
          fVar198 = fVar211 * fVar254 + fVar213 * fVar223;
          fVar201 = fVar201 * fVar304 + fVar212 * fVar238;
          fVar211 = fVar211 * fVar228 + fVar213 * fVar238;
          fVar212 = fVar252 * fVar161 + fVar163 * fVar223;
          fVar213 = fVar254 * fVar162 + fVar166 * fVar223;
          fVar161 = fVar304 * fVar161 + fStack_430 * fVar238;
          fVar162 = fVar228 * fVar162 + fStack_42c * fVar238;
          fVar301 = fVar163 * (1.0 - fVar223) + fVar166 * fVar223;
          fStack_42c = fVar163 * (1.0 - fVar238) + fVar166 * fVar238;
          fVar71 = 1.0 / fVar71;
          auVar118._0_4_ = fVar161 - fVar212;
          auVar118._4_4_ = fVar162 - fVar213;
          auVar118._8_4_ = fVar161 - fVar161;
          auVar118._12_4_ = fVar162 - fVar162;
          auVar155._0_8_ = CONCAT44(fVar211 - fVar198,fVar201 - fVar196);
          auVar155._8_4_ = fVar201 - fVar201;
          auVar155._12_4_ = fVar211 - fVar211;
          auVar266._0_4_ = fVar167 - fVar225;
          auVar266._4_4_ = fVar172 - fVar240;
          auVar266._8_4_ = fVar167 - fVar167;
          auVar266._12_4_ = fVar172 - fVar172;
          auVar221._0_8_ = CONCAT44((fVar240 - fVar123) * 3.0,(fVar225 - fVar122) * 3.0);
          auVar221._8_4_ = (fVar167 - fVar140) * 3.0;
          auVar221._12_4_ = (fVar172 - fVar145) * 3.0;
          auVar192._0_8_ = CONCAT44((fVar198 - fVar240) * 3.0,(fVar196 - fVar225) * 3.0);
          auVar192._8_4_ = (fVar201 - fVar167) * 3.0;
          auVar192._12_4_ = (fVar211 - fVar172) * 3.0;
          auVar249._0_4_ = (fVar212 - fVar196) * 3.0;
          auVar249._4_4_ = (fVar213 - fVar198) * 3.0;
          auVar249._8_4_ = (fVar161 - fVar201) * 3.0;
          auVar249._12_4_ = (fVar162 - fVar211) * 3.0;
          auVar203._8_4_ = auVar192._8_4_;
          auVar203._0_8_ = auVar192._0_8_;
          auVar203._12_4_ = auVar192._12_4_;
          auVar125 = minps(auVar203,auVar249);
          auVar72 = maxps(auVar192,auVar249);
          auVar233._8_4_ = auVar221._8_4_;
          auVar233._0_8_ = auVar221._0_8_;
          auVar233._12_4_ = auVar221._12_4_;
          auVar127 = minps(auVar233,auVar125);
          auVar116 = maxps(auVar221,auVar72);
          auVar26._4_8_ = auVar72._8_8_;
          auVar26._0_4_ = auVar127._4_4_;
          auVar193._0_8_ = auVar26._0_8_ << 0x20;
          auVar193._8_4_ = auVar127._8_4_;
          auVar193._12_4_ = auVar127._12_4_;
          auVar194._8_8_ = auVar127._8_8_;
          auVar194._0_8_ = auVar193._8_8_;
          auVar27._4_8_ = auVar125._8_8_;
          auVar27._0_4_ = auVar116._4_4_;
          auVar204._0_8_ = auVar27._0_8_ << 0x20;
          auVar204._8_4_ = auVar116._8_4_;
          auVar204._12_4_ = auVar116._12_4_;
          auVar205._8_8_ = auVar116._8_8_;
          auVar205._0_8_ = auVar204._8_8_;
          auVar125 = minps(auVar127,auVar194);
          auVar72 = maxps(auVar116,auVar205);
          fVar238 = auVar125._0_4_ * fVar71;
          fVar239 = auVar125._4_4_ * fVar71;
          fVar257 = auVar125._8_4_ * fVar71;
          fVar268 = auVar125._12_4_ * fVar71;
          fVar201 = fVar71 * auVar72._0_4_;
          fVar212 = fVar71 * auVar72._4_4_;
          fVar223 = fVar71 * auVar72._8_4_;
          fVar71 = fVar71 * auVar72._12_4_;
          fVar304 = 1.0 / (fStack_42c - fVar301);
          auVar138._0_8_ = CONCAT44(fVar145 - fVar123,fVar140 - fVar122);
          auVar138._8_4_ = fVar140 - fVar140;
          auVar138._12_4_ = fVar145 - fVar145;
          auVar206._8_4_ = auVar138._8_4_;
          auVar206._0_8_ = auVar138._0_8_;
          auVar206._12_4_ = auVar138._12_4_;
          auVar116 = minps(auVar206,auVar266);
          auVar125 = maxps(auVar138,auVar266);
          auVar97._8_4_ = auVar155._8_4_;
          auVar97._0_8_ = auVar155._0_8_;
          auVar97._12_4_ = auVar155._12_4_;
          auVar72 = minps(auVar97,auVar118);
          auVar116 = minps(auVar116,auVar72);
          auVar72 = maxps(auVar155,auVar118);
          auVar72 = maxps(auVar125,auVar72);
          fVar252 = auVar116._0_4_ * fVar304;
          fVar254 = auVar116._4_4_ * fVar304;
          fVar228 = fVar304 * auVar72._0_4_;
          fVar304 = fVar304 * auVar72._4_4_;
          local_428 = CONCAT44(fStack_42c,fVar301);
          auVar195._4_4_ = fStack_42c;
          auVar195._0_4_ = fVar102;
          auVar195._8_4_ = fVar121;
          auVar195._12_4_ = fVar100;
          fVar122 = (fVar101 + fVar102) * 0.5;
          fVar123 = (fVar301 + fStack_42c) * 0.5;
          fVar140 = (fVar102 + fVar121) * 0.0;
          fVar145 = (fStack_42c + fVar100) * 0.0;
          fVar161 = local_88 * fVar122 + local_318;
          fVar163 = fStack_84 * fVar122 + fStack_314;
          fVar162 = fStack_80 * fVar122 + fStack_310;
          fVar166 = fStack_7c * fVar122 + fStack_30c;
          fVar167 = local_98 * fVar122 + (float)local_328._0_4_;
          fVar172 = fStack_94 * fVar122 + (float)local_328._4_4_;
          fVar196 = fStack_90 * fVar122 + fStack_320;
          fVar198 = fStack_8c * fVar122 + fStack_31c;
          fVar161 = (fVar167 - fVar161) * fVar122 + fVar161;
          fVar163 = (fVar172 - fVar163) * fVar122 + fVar163;
          fVar162 = (fVar196 - fVar162) * fVar122 + fVar162;
          fVar166 = (fVar198 - fVar166) * fVar122 + fVar166;
          fVar167 = (((local_a8 * fVar122 + (float)local_338) - fVar167) * fVar122 + fVar167) -
                    fVar161;
          fVar172 = (((fStack_a4 * fVar122 + local_338._4_4_) - fVar172) * fVar122 + fVar172) -
                    fVar163;
          fVar196 = (((fStack_a0 * fVar122 + (float)uStack_330) - fVar196) * fVar122 + fVar196) -
                    fVar162;
          fVar198 = (((fStack_9c * fVar122 + uStack_330._4_4_) - fVar198) * fVar122 + fVar198) -
                    fVar166;
          fVar161 = fVar122 * fVar167 + fVar161;
          fVar163 = fVar122 * fVar172 + fVar163;
          fVar167 = fVar167 * 3.0;
          fVar172 = fVar172 * 3.0;
          fVar162 = (fVar122 * fVar196 + fVar162) - fVar161;
          fVar166 = (fVar122 * fVar198 + fVar166) - fVar163;
          fVar167 = (fVar196 * 3.0 - fVar167) * fVar123 + fVar167;
          fVar172 = (fVar198 * 3.0 - fVar172) * fVar123 + fVar172;
          auVar119._0_8_ = CONCAT44(fVar167,fVar162) ^ 0x80000000;
          auVar119._8_4_ = fVar167;
          auVar119._12_4_ = fVar167;
          fVar271 = fVar101 - fVar122;
          fVar276 = fVar301 - fVar123;
          fVar286 = fVar102 - fVar140;
          fVar288 = fStack_42c - fVar145;
          fVar290 = fVar102 - fVar122;
          fVar292 = fStack_42c - fVar123;
          fVar121 = fVar121 - fVar140;
          fVar100 = fVar100 - fVar145;
          fVar161 = fVar162 * fVar123 + fVar161;
          fVar163 = fVar166 * fVar123 + fVar163;
          auVar139._0_8_ = CONCAT44(fVar172,fVar166) ^ 0x8000000000000000;
          auVar139._8_4_ = -fVar172;
          auVar139._12_4_ = -fVar172;
          auVar298._0_4_ = fVar166 * fVar167 - fVar172 * fVar162;
          auVar298._4_4_ = auVar298._0_4_;
          auVar298._8_4_ = auVar298._0_4_;
          auVar298._12_4_ = auVar298._0_4_;
          auVar125 = divps(auVar139,auVar298);
          auVar72 = divps(auVar119,auVar298);
          fVar167 = auVar125._0_4_;
          fVar172 = auVar125._4_4_;
          fVar162 = auVar72._0_4_;
          fVar166 = auVar72._4_4_;
          fVar122 = fVar122 - (fVar163 * fVar162 + fVar161 * fVar167);
          fVar140 = fVar123 - (fVar163 * fVar166 + fVar161 * fVar172);
          fVar145 = fVar123 - (fVar163 * auVar72._8_4_ + fVar161 * auVar125._8_4_);
          fVar123 = fVar123 - (fVar163 * auVar72._12_4_ + fVar161 * auVar125._12_4_);
          auVar321._0_8_ = CONCAT44(fVar172 * fVar252,fVar172 * fVar238);
          auVar321._8_4_ = fVar172 * fVar239;
          auVar321._12_4_ = fVar172 * fVar254;
          auVar250._0_4_ = fVar172 * fVar201;
          auVar250._4_4_ = fVar172 * fVar228;
          auVar250._8_4_ = fVar172 * fVar212;
          auVar250._12_4_ = fVar172 * fVar304;
          auVar327._8_4_ = auVar321._8_4_;
          auVar327._0_8_ = auVar321._0_8_;
          auVar327._12_4_ = auVar321._12_4_;
          auVar127 = minps(auVar327,auVar250);
          auVar125 = maxps(auVar250,auVar321);
          auVar156._0_8_ = CONCAT44(fVar166 * fVar254,fVar166 * fVar239);
          auVar156._8_4_ = fVar166 * fVar257;
          auVar156._12_4_ = fVar166 * fVar268;
          auVar322._0_4_ = fVar166 * fVar212;
          auVar322._4_4_ = fVar166 * fVar304;
          auVar322._8_4_ = fVar166 * fVar223;
          auVar322._12_4_ = fVar166 * fVar71;
          auVar234._8_4_ = auVar156._8_4_;
          auVar234._0_8_ = auVar156._0_8_;
          auVar234._12_4_ = auVar156._12_4_;
          auVar72 = minps(auVar234,auVar322);
          auVar116 = maxps(auVar322,auVar156);
          fVar161 = 0.0 - (auVar116._0_4_ + auVar125._0_4_);
          fVar163 = 1.0 - (auVar116._4_4_ + auVar125._4_4_);
          fVar196 = 0.0 - (auVar116._8_4_ + auVar125._8_4_);
          fVar198 = 0.0 - (auVar116._12_4_ + auVar125._12_4_);
          fVar211 = 0.0 - (auVar72._0_4_ + auVar127._0_4_);
          fVar213 = 1.0 - (auVar72._4_4_ + auVar127._4_4_);
          fVar225 = 0.0 - (auVar72._8_4_ + auVar127._8_4_);
          fVar240 = 0.0 - (auVar72._12_4_ + auVar127._12_4_);
          auVar251._0_8_ = CONCAT44(fVar276 * fVar163,fVar271 * fVar161);
          auVar251._8_4_ = fVar286 * fVar196;
          auVar251._12_4_ = fVar288 * fVar198;
          auVar299._0_8_ = CONCAT44(fVar252 * fVar167,fVar238 * fVar167);
          auVar299._8_4_ = fVar239 * fVar167;
          auVar299._12_4_ = fVar254 * fVar167;
          auVar235._0_4_ = fVar167 * fVar201;
          auVar235._4_4_ = fVar167 * fVar228;
          auVar235._8_4_ = fVar167 * fVar212;
          auVar235._12_4_ = fVar167 * fVar304;
          auVar308._8_4_ = auVar299._8_4_;
          auVar308._0_8_ = auVar299._0_8_;
          auVar308._12_4_ = auVar299._12_4_;
          auVar125 = minps(auVar308,auVar235);
          auVar72 = maxps(auVar235,auVar299);
          auVar207._0_8_ = CONCAT44(fVar254 * fVar162,fVar239 * fVar162);
          auVar207._8_4_ = fVar257 * fVar162;
          auVar207._12_4_ = fVar268 * fVar162;
          auVar323._0_4_ = fVar162 * fVar212;
          auVar323._4_4_ = fVar162 * fVar304;
          auVar323._8_4_ = fVar162 * fVar223;
          auVar323._12_4_ = fVar162 * fVar71;
          auVar328._8_4_ = auVar207._8_4_;
          auVar328._0_8_ = auVar207._0_8_;
          auVar328._12_4_ = auVar207._12_4_;
          auVar127 = minps(auVar328,auVar323);
          auVar300._0_4_ = fVar271 * fVar211;
          auVar300._4_4_ = fVar276 * fVar213;
          auVar300._8_4_ = fVar286 * fVar225;
          auVar300._12_4_ = fVar288 * fVar240;
          auVar157._0_8_ = CONCAT44(fVar163 * fVar292,fVar161 * fVar290);
          auVar157._8_4_ = fVar196 * fVar121;
          auVar157._12_4_ = fVar198 * fVar100;
          auVar165._0_4_ = fVar211 * fVar290;
          auVar165._4_4_ = fVar213 * fVar292;
          auVar165._8_4_ = fVar225 * fVar121;
          auVar165._12_4_ = fVar240 * fVar100;
          auVar116 = maxps(auVar323,auVar207);
          auVar318._0_4_ = auVar116._0_4_ + auVar72._0_4_;
          auVar318._4_4_ = auVar116._4_4_ + auVar72._4_4_;
          auVar318._8_4_ = auVar116._8_4_ + auVar72._8_4_;
          auVar318._12_4_ = auVar116._12_4_ + auVar72._12_4_;
          fVar71 = 1.0 - (auVar127._0_4_ + auVar125._0_4_);
          fVar161 = 0.0 - (auVar127._4_4_ + auVar125._4_4_);
          fVar163 = 0.0 - (auVar127._8_4_ + auVar125._8_4_);
          fVar196 = 0.0 - (auVar127._12_4_ + auVar125._12_4_);
          auVar236._0_8_ =
               CONCAT44(fVar276 * (0.0 - auVar318._4_4_),fVar271 * (1.0 - auVar318._0_4_));
          auVar236._8_4_ = fVar286 * (0.0 - auVar318._8_4_);
          auVar236._12_4_ = fVar288 * (0.0 - auVar318._12_4_);
          auVar267._0_4_ = fVar271 * fVar71;
          auVar267._4_4_ = fVar276 * fVar161;
          auVar267._8_4_ = fVar286 * fVar163;
          auVar267._12_4_ = fVar288 * fVar196;
          auVar208._0_8_ =
               CONCAT44((0.0 - auVar318._4_4_) * fVar292,(1.0 - auVar318._0_4_) * fVar290);
          auVar208._8_4_ = (0.0 - auVar318._8_4_) * fVar121;
          auVar208._12_4_ = (0.0 - auVar318._12_4_) * fVar100;
          auVar222._0_4_ = fVar71 * fVar290;
          auVar222._4_4_ = fVar161 * fVar292;
          auVar222._8_4_ = fVar163 * fVar121;
          auVar222._12_4_ = fVar196 * fVar100;
          auVar285._8_4_ = auVar236._8_4_;
          auVar285._0_8_ = auVar236._0_8_;
          auVar285._12_4_ = auVar236._12_4_;
          auVar72 = minps(auVar285,auVar267);
          auVar309._8_4_ = auVar208._8_4_;
          auVar309._0_8_ = auVar208._0_8_;
          auVar309._12_4_ = auVar208._12_4_;
          auVar125 = minps(auVar309,auVar222);
          auVar127 = minps(auVar72,auVar125);
          auVar125 = maxps(auVar267,auVar236);
          auVar72 = maxps(auVar222,auVar208);
          auVar116 = maxps(auVar72,auVar125);
          auVar209._8_4_ = auVar251._8_4_;
          auVar209._0_8_ = auVar251._0_8_;
          auVar209._12_4_ = auVar251._12_4_;
          auVar72 = minps(auVar209,auVar300);
          auVar237._8_4_ = auVar157._8_4_;
          auVar237._0_8_ = auVar157._0_8_;
          auVar237._12_4_ = auVar157._12_4_;
          auVar125 = minps(auVar237,auVar165);
          auVar125 = minps(auVar72,auVar125);
          auVar317 = maxps(auVar300,auVar251);
          auVar72 = maxps(auVar165,auVar157);
          auVar72 = maxps(auVar72,auVar317);
          auVar210._0_4_ = auVar127._4_4_ + auVar127._0_4_ + fVar122;
          auVar210._4_4_ = auVar125._4_4_ + auVar125._0_4_ + fVar140;
          auVar210._8_4_ = auVar127._8_4_ + auVar127._4_4_ + fVar145;
          auVar210._12_4_ = auVar127._12_4_ + auVar125._4_4_ + fVar123;
          fVar71 = auVar116._4_4_ + auVar116._0_4_ + fVar122;
          fVar100 = auVar72._4_4_ + auVar72._0_4_ + fVar140;
          auVar158._4_4_ = fVar100;
          auVar158._0_4_ = fVar71;
          auVar29._4_4_ = fVar301;
          auVar29._0_4_ = fVar101;
          auVar29._8_4_ = fVar102;
          auVar29._12_4_ = fStack_42c;
          auVar125 = maxps(auVar29,auVar210);
          auVar158._8_4_ = auVar116._8_4_ + auVar116._4_4_ + fVar145;
          auVar158._12_4_ = auVar116._12_4_ + auVar72._4_4_ + fVar123;
          auVar72 = minps(auVar158,auVar195);
          iVar59 = -(uint)(auVar72._0_4_ < auVar125._0_4_);
          iVar67 = -(uint)(auVar72._4_4_ < auVar125._4_4_);
          auVar160._4_4_ = iVar67;
          auVar160._0_4_ = iVar59;
          auVar160._8_4_ = iVar67;
          auVar160._12_4_ = iVar67;
          auVar159._8_8_ = auVar160._8_8_;
          auVar159._4_4_ = iVar59;
          auVar159._0_4_ = iVar59;
          uVar66 = movmskpd((int)uVar60,auVar159);
          uVar60 = (ulong)uVar66;
          fStack_430 = fVar102;
          if (uVar66 == 0) {
            uVar60 = 0;
            if (auVar210._0_4_ <= fVar101) {
              auVar318._0_12_ = ZEXT812(0x40400000);
              auVar318._12_4_ = 0.0;
              auVar329._4_4_ = fStack_314;
              auVar329._0_4_ = local_318;
              auVar329._8_4_ = fStack_310;
              auVar329._12_4_ = fStack_30c;
            }
            else {
              auVar318._0_12_ = ZEXT812(0x40400000);
              auVar318._12_4_ = 0.0;
              auVar329._4_4_ = fStack_314;
              auVar329._0_4_ = local_318;
              auVar329._8_4_ = fStack_310;
              auVar329._12_4_ = fStack_30c;
              if (fVar71 < fVar102) {
                iVar59 = -(uint)(fVar100 < fStack_42c);
                uVar60 = (ulong)CONCAT11((char)((uint)iVar59 >> 8),
                                         (byte)iVar59 & fVar301 < auVar210._4_4_);
              }
            }
            bVar53 = bVar64 | (byte)uVar60;
            uVar56 = (ulong)CONCAT31(uVar25,bVar53);
            if (bVar53 == 1) {
              uVar56 = 200;
              do {
                fVar100 = 1.0 - fVar122;
                fVar121 = fVar122 * fVar122 * fVar122;
                fVar145 = auVar318._0_4_;
                fVar102 = fVar122 * fVar122 * fVar145 * fVar100;
                fVar71 = fVar100 * fVar100 * fVar100;
                fVar123 = fVar122 * fVar145 * fVar100 * fVar100;
                fVar100 = fVar71 * auVar329._0_4_ +
                          fVar123 * (float)local_328._0_4_ +
                          fVar102 * (float)local_338 + fVar121 * (float)local_b8._0_4_;
                fVar101 = fVar71 * auVar329._4_4_ +
                          fVar123 * (float)local_328._4_4_ +
                          fVar102 * local_338._4_4_ + fVar121 * (float)local_b8._4_4_;
                fVar100 = ((fVar71 * auVar329._8_4_ +
                           fVar123 * fStack_320 + fVar102 * (float)uStack_330 + fVar121 * fStack_b0)
                          - fVar100) * fVar140 + fVar100;
                fVar101 = ((fVar71 * auVar329._12_4_ +
                           fVar123 * fStack_31c + fVar102 * uStack_330._4_4_ + fVar121 * fStack_ac)
                          - fVar101) * fVar140 + fVar101;
                fVar122 = fVar122 - (fVar101 * fVar162 + fVar100 * fVar167);
                fVar140 = fVar140 - (fVar101 * fVar166 + fVar100 * fVar172);
                fVar71 = ABS(fVar101);
                if (ABS(fVar101) <= ABS(fVar100)) {
                  fVar71 = ABS(fVar100);
                }
                if (fVar71 < fVar142) {
                  if ((((0.0 <= fVar122) && (fVar122 <= 1.0)) && (0.0 <= fVar140)) &&
                     (fVar140 <= 1.0)) {
                    fVar71 = (pre->ray_space).vx.field_0.m128[2];
                    fVar100 = (pre->ray_space).vy.field_0.m128[2];
                    fVar101 = (pre->ray_space).vz.field_0.m128[2];
                    fVar102 = (ray->org).field_0.m128[0];
                    fVar121 = (ray->org).field_0.m128[1];
                    fVar123 = (ray->org).field_0.m128[2];
                    fVar167 = 1.0 - fVar140;
                    fVar166 = 1.0 - fVar122;
                    fVar161 = fVar166 * fVar166 * fVar166;
                    fVar162 = fVar122 * fVar145 * fVar166 * fVar166;
                    fVar163 = fVar122 * fVar122 * fVar122;
                    fVar145 = fVar122 * fVar122 * fVar145 * fVar166;
                    fVar71 = (((fStack_390 - fVar123) * fVar101 +
                              (fStack_394 - fVar121) * fVar100 + (local_398 - fVar102) * fVar71) *
                              fVar167 +
                             ((fStack_380 - fVar123) * fVar101 +
                             (fStack_384 - fVar121) * fVar100 + (local_388 - fVar102) * fVar71) *
                             fVar140) * fVar161 +
                             (((fStack_3a0 - fVar123) * fVar101 +
                              (fStack_3a4 - fVar121) * fVar100 + (local_3a8 - fVar102) * fVar71) *
                              fVar167 +
                             ((fStack_370 - fVar123) * fVar101 +
                             (fStack_374 - fVar121) * fVar100 + (local_378 - fVar102) * fVar71) *
                             fVar140) * fVar162 +
                             (((fStack_3b0 - fVar123) * fVar101 +
                              (fStack_3b4 - fVar121) * fVar100 + (local_3b8 - fVar102) * fVar71) *
                              fVar167 +
                             ((fStack_3d0 - fVar123) * fVar101 +
                             (fStack_3d4 - fVar121) * fVar100 + (local_3d8 - fVar102) * fVar71) *
                             fVar140) * fVar145 +
                             (fVar167 * ((fStack_3c0 - fVar123) * fVar101 +
                                        (fStack_3c4 - fVar121) * fVar100 +
                                        (local_3c8 - fVar102) * fVar71) +
                             ((fStack_2b0 - fVar123) * fVar101 +
                             (fStack_2b4 - fVar121) * fVar100 + (local_2b8 - fVar102) * fVar71) *
                             fVar140) * fVar163;
                    if (((ray->org).field_0.m128[3] <= fVar71) &&
                       (fVar100 = ray->tfar, fVar71 <= fVar100)) {
                      fVar123 = 1.0 - fVar140;
                      fVar167 = 1.0 - fVar140;
                      fVar172 = 1.0 - fVar140;
                      fVar101 = local_3a8 * fVar123 + local_378 * fVar140;
                      fVar102 = fStack_3a4 * fVar167 + fStack_374 * fVar140;
                      fVar121 = fStack_3a0 * fVar172 + fStack_370 * fVar140;
                      fVar196 = local_3b8 * fVar123 + local_3d8 * fVar140;
                      fVar201 = fStack_3b4 * fVar167 + fStack_3d4 * fVar140;
                      fVar212 = fStack_3b0 * fVar172 + fStack_3d0 * fVar140;
                      fVar198 = fVar196 - fVar101;
                      fVar211 = fVar201 - fVar102;
                      fVar213 = fVar212 - fVar121;
                      fVar101 = (((fVar101 - (local_398 * fVar123 + local_388 * fVar140)) * fVar166
                                 + fVar122 * fVar198) * fVar166 +
                                (fVar198 * fVar166 +
                                ((fVar123 * local_3c8 + fVar140 * local_2b8) - fVar196) * fVar122) *
                                fVar122) * 3.0;
                      fVar102 = (((fVar102 - (fStack_394 * fVar167 + fStack_384 * fVar140)) *
                                  fVar166 + fVar122 * fVar211) * fVar166 +
                                (fVar211 * fVar166 +
                                ((fVar167 * fStack_3c4 + fVar140 * fStack_2b4) - fVar201) * fVar122)
                                * fVar122) * 3.0;
                      fVar121 = (((fVar121 - (fStack_390 * fVar172 + fStack_380 * fVar140)) *
                                  fVar166 + fVar122 * fVar213) * fVar166 +
                                (fVar213 * fVar166 +
                                ((fVar172 * fStack_3c0 + fVar140 * fStack_2b0) - fVar212) * fVar122)
                                * fVar122) * 3.0;
                      pGVar12 = (context->scene->geometries).items[local_360].ptr;
                      if ((pGVar12->mask & ray->mask) == 0) {
                        uVar56 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar56 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar123 = fVar161 * local_188 +
                                  fVar162 * local_198 + fVar145 * local_1a8 + fVar163 * local_1b8;
                        fVar166 = fVar161 * fStack_184 +
                                  fVar162 * fStack_194 + fVar145 * fStack_1a4 + fVar163 * fStack_1b4
                        ;
                        fVar145 = fVar161 * fStack_180 +
                                  fVar162 * fStack_190 + fVar145 * fStack_1a0 + fVar163 * fStack_1b0
                        ;
                        local_1e8 = CONCAT44(fVar123 * fVar121 - fVar101 * fVar145,
                                             fVar145 * fVar102 - fVar121 * fVar166);
                        local_1e0 = fVar166 * fVar101 - fVar102 * fVar123;
                        local_1dc = fVar122;
                        fStack_1d8 = fVar140;
                        local_1d4 = (int)local_300;
                        local_1d0 = (int)local_360;
                        local_1cc = context->user->instID[0];
                        local_1c8 = context->user->instPrimID[0];
                        ray->tfar = fVar71;
                        local_3dc = 0xffffffff;
                        local_2e8.valid = &local_3dc;
                        local_2e8.geometryUserPtr = pGVar12->userPtr;
                        local_2e8.context = context->user;
                        local_2e8.hit = (RTCHitN *)&local_1e8;
                        local_2e8.N = 1;
                        local_2e8.ray = (RTCRayN *)ray;
                        if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar12->occlusionFilterN)(&local_2e8), *local_2e8.valid != 0)) {
                          p_Var58 = context->args->filter;
                          if (p_Var58 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var58)(&local_2e8);
                            }
                            p_Var58 = (RTCFilterFunctionN)local_2e8.valid;
                            if (*local_2e8.valid == 0) goto LAB_00c36c7b;
                          }
                          uVar56 = CONCAT71((int7)((ulong)p_Var58 >> 8),1);
                        }
                        else {
LAB_00c36c7b:
                          uVar56 = 0;
                        }
                        if ((char)uVar56 == '\0') {
                          ray->tfar = fVar100;
                        }
                      }
                      local_43c = (uint)(byte)((byte)local_43c | (byte)uVar56);
                      uVar60 = (ulong)local_43c;
                    }
                  }
                  break;
                }
                uVar56 = uVar56 - 1;
              } while (uVar56 != 0);
            }
            else {
              bVar18 = false;
            }
          }
        }
      }
    } while (bVar18);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }